

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 uVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  int iVar60;
  undefined1 auVar61 [32];
  byte bVar62;
  ulong uVar63;
  uint uVar64;
  uint uVar65;
  long lVar66;
  long lVar67;
  Geometry *pGVar68;
  long lVar69;
  byte bVar70;
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  float fVar75;
  float fVar76;
  float fVar135;
  float fVar137;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar136;
  float fVar138;
  float fVar140;
  float fVar141;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar139;
  float fVar142;
  float fVar143;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  vint4 bi_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined4 uVar157;
  undefined8 uVar158;
  vint4 bi_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar164;
  float fVar172;
  vint4 bi;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  vint4 ai_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  vint4 ai;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  vint4 ai_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  float fVar203;
  float fVar204;
  undefined1 auVar202 [16];
  float fVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5f0 [16];
  Primitive *local_5e0;
  ulong local_5d8;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [16];
  Geometry *local_548;
  Precalculations *local_540;
  ulong local_538;
  LinearSpace3fa *local_530;
  ulong local_528;
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  int local_450;
  int iStack_44c;
  int iStack_448;
  int iStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar63 = (ulong)(byte)prim[1];
  lVar69 = uVar63 * 0x25;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x11 + 6)));
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  uVar157 = *(undefined4 *)(prim + lVar69 + 0x12);
  auVar215._4_4_ = uVar157;
  auVar215._0_4_ = uVar157;
  auVar215._8_4_ = uVar157;
  auVar215._12_4_ = uVar157;
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar77 = vsubps_avx512vl(auVar89,*(undefined1 (*) [16])(prim + lVar69 + 6));
  fVar164 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar69 + 0x16)) *
            *(float *)(prim + lVar69 + 0x1a);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar19 = vpmovsxwd_avx(auVar89);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar20 = vpmovsxwd_avx(auVar92);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar144 = vpmovsxwd_avx(auVar91);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar160 = vpmovsxwd_avx(auVar90);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar89 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar77 = vmulps_avx512vl(auVar215,auVar77);
  auVar78 = vmulps_avx512vl(auVar215,auVar89);
  auVar79 = vcvtdq2ps_avx512vl(auVar18);
  auVar80 = vcvtdq2ps_avx512vl(auVar85);
  auVar81 = vcvtdq2ps_avx512vl(auVar81);
  auVar82 = vcvtdq2ps_avx512vl(auVar82);
  auVar83 = vcvtdq2ps_avx512vl(auVar83);
  auVar89 = vcvtdq2ps_avx(auVar84);
  auVar92 = vcvtdq2ps_avx(auVar86);
  auVar91 = vcvtdq2ps_avx(auVar87);
  auVar90 = vcvtdq2ps_avx(auVar88);
  uVar157 = auVar78._0_4_;
  auVar181._4_4_ = uVar157;
  auVar181._0_4_ = uVar157;
  auVar181._8_4_ = uVar157;
  auVar181._12_4_ = uVar157;
  auVar18 = vshufps_avx(auVar78,auVar78,0x55);
  auVar85 = vshufps_avx(auVar78,auVar78,0xaa);
  auVar84 = vmulps_avx512vl(auVar85,auVar81);
  auVar159._0_4_ = auVar85._0_4_ * auVar89._0_4_;
  auVar159._4_4_ = auVar85._4_4_ * auVar89._4_4_;
  auVar159._8_4_ = auVar85._8_4_ * auVar89._8_4_;
  auVar159._12_4_ = auVar85._12_4_ * auVar89._12_4_;
  auVar78._0_4_ = auVar90._0_4_ * auVar85._0_4_;
  auVar78._4_4_ = auVar90._4_4_ * auVar85._4_4_;
  auVar78._8_4_ = auVar90._8_4_ * auVar85._8_4_;
  auVar78._12_4_ = auVar90._12_4_ * auVar85._12_4_;
  auVar85 = vfmadd231ps_avx512vl(auVar84,auVar18,auVar80);
  auVar84 = vfmadd231ps_avx512vl(auVar159,auVar18,auVar83);
  auVar18 = vfmadd231ps_fma(auVar78,auVar91,auVar18);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar181,auVar79);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar181,auVar82);
  auVar18 = vfmadd231ps_fma(auVar18,auVar92,auVar181);
  auVar86 = vbroadcastss_avx512vl(auVar77);
  auVar87 = vshufps_avx512vl(auVar77,auVar77,0x55);
  auVar88 = vshufps_avx512vl(auVar77,auVar77,0xaa);
  auVar81 = vmulps_avx512vl(auVar88,auVar81);
  auVar89 = vmulps_avx512vl(auVar88,auVar89);
  auVar90 = vmulps_avx512vl(auVar88,auVar90);
  auVar81 = vfmadd231ps_avx512vl(auVar81,auVar87,auVar80);
  auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar83);
  auVar91 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar91);
  auVar78 = vfmadd231ps_avx512vl(auVar81,auVar86,auVar79);
  auVar79 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar82);
  auVar77 = vfmadd231ps_fma(auVar91,auVar86,auVar92);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar218 = ZEXT1664(auVar89);
  auVar92 = vandps_avx512vl(auVar85,auVar89);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  uVar73 = vcmpps_avx512vl(auVar92,auVar213,1);
  bVar12 = (bool)((byte)uVar73 & 1);
  auVar80._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._0_4_;
  bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._4_4_;
  bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._8_4_;
  bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._12_4_;
  auVar92 = vandps_avx512vl(auVar84,auVar89);
  uVar73 = vcmpps_avx512vl(auVar92,auVar213,1);
  bVar12 = (bool)((byte)uVar73 & 1);
  auVar93._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._0_4_;
  bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._4_4_;
  bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._8_4_;
  bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._12_4_;
  auVar89 = vandps_avx512vl(auVar18,auVar89);
  uVar73 = vcmpps_avx512vl(auVar89,auVar213,1);
  bVar12 = (bool)((byte)uVar73 & 1);
  auVar94._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar18._0_4_;
  bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar18._4_4_;
  bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar18._8_4_;
  bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar18._12_4_;
  auVar209._8_4_ = 0x3f800000;
  auVar209._0_8_ = 0x3f8000003f800000;
  auVar209._12_4_ = 0x3f800000;
  auVar92 = vrcp14ps_avx512vl(auVar80);
  auVar89 = vfnmadd213ps_fma(auVar80,auVar92,auVar209);
  auVar91 = vfmadd132ps_fma(auVar89,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar93);
  auVar89 = vfnmadd213ps_fma(auVar93,auVar92,auVar209);
  auVar90 = vfmadd132ps_fma(auVar89,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar94);
  auVar89 = vfnmadd213ps_fma(auVar94,auVar92,auVar209);
  auVar87 = vfmadd132ps_fma(auVar89,auVar92,auVar92);
  auVar195._4_4_ = fVar164;
  auVar195._0_4_ = fVar164;
  auVar195._8_4_ = fVar164;
  auVar195._12_4_ = fVar164;
  auVar89 = vcvtdq2ps_avx(auVar19);
  auVar92 = vcvtdq2ps_avx(auVar20);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar88 = vfmadd213ps_fma(auVar92,auVar195,auVar89);
  auVar89 = vcvtdq2ps_avx(auVar144);
  auVar92 = vcvtdq2ps_avx(auVar160);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar19 = vfmadd213ps_fma(auVar92,auVar195,auVar89);
  auVar89 = vcvtdq2ps_avx(auVar6);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar63 * 0x16 + 6);
  auVar92 = vpmovsxwd_avx(auVar18);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar6 = vfmadd213ps_fma(auVar92,auVar195,auVar89);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar63 * 0x14 + 6);
  auVar89 = vpmovsxwd_avx(auVar85);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar92 = vpmovsxwd_avx(auVar81);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar18 = vfmadd213ps_fma(auVar92,auVar195,auVar89);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar89 = vpmovsxwd_avx(auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar63 * 0x21 + 6);
  auVar92 = vpmovsxwd_avx(auVar83);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar85 = vfmadd213ps_fma(auVar92,auVar195,auVar89);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar63 * 0x1f + 6);
  auVar89 = vpmovsxwd_avx(auVar84);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar92 = vpmovsxwd_avx(auVar86);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar92 = vfmadd213ps_fma(auVar92,auVar195,auVar89);
  auVar89 = vsubps_avx(auVar88,auVar78);
  auVar196._0_4_ = auVar91._0_4_ * auVar89._0_4_;
  auVar196._4_4_ = auVar91._4_4_ * auVar89._4_4_;
  auVar196._8_4_ = auVar91._8_4_ * auVar89._8_4_;
  auVar196._12_4_ = auVar91._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar19,auVar78);
  auVar165._0_4_ = auVar91._0_4_ * auVar89._0_4_;
  auVar165._4_4_ = auVar91._4_4_ * auVar89._4_4_;
  auVar165._8_4_ = auVar91._8_4_ * auVar89._8_4_;
  auVar165._12_4_ = auVar91._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar6,auVar79);
  auVar199._0_4_ = auVar90._0_4_ * auVar89._0_4_;
  auVar199._4_4_ = auVar90._4_4_ * auVar89._4_4_;
  auVar199._8_4_ = auVar90._8_4_ * auVar89._8_4_;
  auVar199._12_4_ = auVar90._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar18,auVar79);
  auVar160._0_4_ = auVar90._0_4_ * auVar89._0_4_;
  auVar160._4_4_ = auVar90._4_4_ * auVar89._4_4_;
  auVar160._8_4_ = auVar90._8_4_ * auVar89._8_4_;
  auVar160._12_4_ = auVar90._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar85,auVar77);
  auVar79._0_4_ = auVar87._0_4_ * auVar89._0_4_;
  auVar79._4_4_ = auVar87._4_4_ * auVar89._4_4_;
  auVar79._8_4_ = auVar87._8_4_ * auVar89._8_4_;
  auVar79._12_4_ = auVar87._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar92,auVar77);
  auVar144._0_4_ = auVar87._0_4_ * auVar89._0_4_;
  auVar144._4_4_ = auVar87._4_4_ * auVar89._4_4_;
  auVar144._8_4_ = auVar87._8_4_ * auVar89._8_4_;
  auVar144._12_4_ = auVar87._12_4_ * auVar89._12_4_;
  auVar89 = vpminsd_avx(auVar196,auVar165);
  auVar92 = vpminsd_avx(auVar199,auVar160);
  auVar89 = vmaxps_avx(auVar89,auVar92);
  auVar92 = vpminsd_avx(auVar79,auVar144);
  uVar157 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar87._4_4_ = uVar157;
  auVar87._0_4_ = uVar157;
  auVar87._8_4_ = uVar157;
  auVar87._12_4_ = uVar157;
  auVar92 = vmaxps_avx512vl(auVar92,auVar87);
  auVar89 = vmaxps_avx(auVar89,auVar92);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  local_190 = vmulps_avx512vl(auVar89,auVar88);
  auVar89 = vpmaxsd_avx(auVar196,auVar165);
  auVar92 = vpmaxsd_avx(auVar199,auVar160);
  auVar89 = vminps_avx(auVar89,auVar92);
  auVar92 = vpmaxsd_avx(auVar79,auVar144);
  uVar157 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar19._4_4_ = uVar157;
  auVar19._0_4_ = uVar157;
  auVar19._8_4_ = uVar157;
  auVar19._12_4_ = uVar157;
  auVar92 = vminps_avx512vl(auVar92,auVar19);
  auVar89 = vminps_avx(auVar89,auVar92);
  auVar20._8_4_ = 0x3f800003;
  auVar20._0_8_ = 0x3f8000033f800003;
  auVar20._12_4_ = 0x3f800003;
  auVar89 = vmulps_avx512vl(auVar89,auVar20);
  auVar92 = vpbroadcastd_avx512vl();
  uVar158 = vcmpps_avx512vl(local_190,auVar89,2);
  uVar21 = vpcmpgtd_avx512vl(auVar92,_DAT_01f4ad30);
  local_528 = (ulong)((byte)uVar158 & 0xf & (byte)uVar21);
  local_530 = pre->ray_space + k;
  auVar219 = ZEXT464(0xbf800000);
  local_4f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5e0 = prim;
  local_540 = pre;
  do {
    if (local_528 == 0) {
      return;
    }
    lVar69 = 0;
    for (uVar73 = local_528; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
      lVar69 = lVar69 + 1;
    }
    uVar71 = *(uint *)(prim + 2);
    local_5d8 = (ulong)uVar71;
    uVar65 = *(uint *)(prim + lVar69 * 4 + 6);
    uVar73 = (ulong)uVar65;
    pGVar68 = (context->scene->geometries).items[local_5d8].ptr;
    uVar63 = (ulong)*(uint *)(*(long *)&pGVar68->field_0x58 +
                             uVar73 * pGVar68[1].super_RefCount.refCounter.
                                      super___atomic_base<unsigned_long>._M_i);
    fVar164 = (pGVar68->time_range).lower;
    fVar164 = pGVar68->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar164) / ((pGVar68->time_range).upper - fVar164))
    ;
    auVar89 = vroundss_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),9);
    auVar92 = vaddss_avx512f(ZEXT416((uint)pGVar68->fnumTimeSegments),auVar219._0_16_);
    auVar89 = vminss_avx(auVar89,auVar92);
    auVar89 = vmaxss_avx(ZEXT816(0) << 0x20,auVar89);
    fVar164 = fVar164 - auVar89._0_4_;
    _Var9 = pGVar68[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar67 = (long)(int)auVar89._0_4_ * 0x38;
    lVar69 = *(long *)(_Var9 + 0x10 + lVar67);
    lVar66 = *(long *)(_Var9 + 0x38 + lVar67);
    lVar10 = *(long *)(_Var9 + 0x48 + lVar67);
    auVar161._4_4_ = fVar164;
    auVar161._0_4_ = fVar164;
    auVar161._8_4_ = fVar164;
    auVar161._12_4_ = fVar164;
    pfVar3 = (float *)(lVar66 + uVar63 * lVar10);
    auVar210._0_4_ = fVar164 * *pfVar3;
    auVar210._4_4_ = fVar164 * pfVar3[1];
    auVar210._8_4_ = fVar164 * pfVar3[2];
    auVar210._12_4_ = fVar164 * pfVar3[3];
    pfVar3 = (float *)(lVar66 + (uVar63 + 1) * lVar10);
    auVar214._0_4_ = fVar164 * *pfVar3;
    auVar214._4_4_ = fVar164 * pfVar3[1];
    auVar214._8_4_ = fVar164 * pfVar3[2];
    auVar214._12_4_ = fVar164 * pfVar3[3];
    auVar89 = vmulps_avx512vl(auVar161,*(undefined1 (*) [16])(lVar66 + (uVar63 + 2) * lVar10));
    auVar92 = vmulps_avx512vl(auVar161,*(undefined1 (*) [16])(lVar66 + lVar10 * (uVar63 + 3)));
    lVar66 = *(long *)(_Var9 + lVar67);
    fVar164 = 1.0 - fVar164;
    auVar77._4_4_ = fVar164;
    auVar77._0_4_ = fVar164;
    auVar77._8_4_ = fVar164;
    auVar77._12_4_ = fVar164;
    local_5a0 = vfmadd231ps_fma(auVar210,auVar77,*(undefined1 (*) [16])(lVar66 + lVar69 * uVar63));
    local_5b0 = vfmadd231ps_fma(auVar214,auVar77,
                                *(undefined1 (*) [16])(lVar66 + lVar69 * (uVar63 + 1)));
    local_5c0 = vfmadd231ps_avx512vl
                          (auVar89,auVar77,*(undefined1 (*) [16])(lVar66 + lVar69 * (uVar63 + 2)));
    _local_5d0 = vfmadd231ps_avx512vl
                           (auVar92,auVar77,*(undefined1 (*) [16])(lVar66 + lVar69 * (uVar63 + 3)));
    iVar7 = (int)pGVar68[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar91 = vsubps_avx(local_5a0,auVar89);
    uVar157 = auVar91._0_4_;
    auVar173._4_4_ = uVar157;
    auVar173._0_4_ = uVar157;
    auVar173._8_4_ = uVar157;
    auVar173._12_4_ = uVar157;
    auVar92 = vshufps_avx(auVar91,auVar91,0x55);
    aVar4 = (local_530->vx).field_0;
    aVar5 = (local_530->vy).field_0;
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    fVar164 = (local_530->vz).field_0.m128[0];
    fVar203 = *(float *)((long)&(local_530->vz).field_0 + 4);
    fVar204 = *(float *)((long)&(local_530->vz).field_0 + 8);
    fVar205 = *(float *)((long)&(local_530->vz).field_0 + 0xc);
    auVar202._0_4_ = fVar164 * auVar91._0_4_;
    auVar202._4_4_ = fVar203 * auVar91._4_4_;
    auVar202._8_4_ = fVar204 * auVar91._8_4_;
    auVar202._12_4_ = fVar205 * auVar91._12_4_;
    auVar92 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar92);
    auVar90 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar173);
    auVar91 = vsubps_avx(local_5b0,auVar89);
    uVar157 = auVar91._0_4_;
    auVar174._4_4_ = uVar157;
    auVar174._0_4_ = uVar157;
    auVar174._8_4_ = uVar157;
    auVar174._12_4_ = uVar157;
    auVar92 = vshufps_avx(auVar91,auVar91,0x55);
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar206._0_4_ = fVar164 * auVar91._0_4_;
    auVar206._4_4_ = fVar203 * auVar91._4_4_;
    auVar206._8_4_ = fVar204 * auVar91._8_4_;
    auVar206._12_4_ = fVar205 * auVar91._12_4_;
    auVar92 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar5,auVar92);
    auVar6 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar174);
    auVar91 = vsubps_avx512vl(local_5c0,auVar89);
    uVar157 = auVar91._0_4_;
    auVar175._4_4_ = uVar157;
    auVar175._0_4_ = uVar157;
    auVar175._8_4_ = uVar157;
    auVar175._12_4_ = uVar157;
    auVar92 = vshufps_avx(auVar91,auVar91,0x55);
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar208._0_4_ = fVar164 * auVar91._0_4_;
    auVar208._4_4_ = fVar203 * auVar91._4_4_;
    auVar208._8_4_ = fVar204 * auVar91._8_4_;
    auVar208._12_4_ = fVar205 * auVar91._12_4_;
    auVar92 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar5,auVar92);
    auVar91 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar175);
    auVar92 = vsubps_avx512vl(_local_5d0,auVar89);
    uVar157 = auVar92._0_4_;
    auVar176._4_4_ = uVar157;
    auVar176._0_4_ = uVar157;
    auVar176._8_4_ = uVar157;
    auVar176._12_4_ = uVar157;
    auVar89 = vshufps_avx(auVar92,auVar92,0x55);
    auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
    auVar212._0_4_ = fVar164 * auVar92._0_4_;
    auVar212._4_4_ = fVar203 * auVar92._4_4_;
    auVar212._8_4_ = fVar204 * auVar92._8_4_;
    auVar212._12_4_ = fVar205 * auVar92._12_4_;
    auVar89 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar5,auVar89);
    lVar69 = (long)iVar7 * 0x44;
    auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar69);
    auVar18 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar176);
    uVar157 = auVar90._0_4_;
    local_2e0._4_4_ = uVar157;
    local_2e0._0_4_ = uVar157;
    local_2e0._8_4_ = uVar157;
    local_2e0._12_4_ = uVar157;
    local_2e0._16_4_ = uVar157;
    local_2e0._20_4_ = uVar157;
    local_2e0._24_4_ = uVar157;
    local_2e0._28_4_ = uVar157;
    auVar95._8_4_ = 1;
    auVar95._0_8_ = 0x100000001;
    auVar95._12_4_ = 1;
    auVar95._16_4_ = 1;
    auVar95._20_4_ = 1;
    auVar95._24_4_ = 1;
    auVar95._28_4_ = 1;
    local_300 = vpermps_avx2(auVar95,ZEXT1632(auVar90));
    auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x484);
    uVar157 = auVar6._0_4_;
    auVar177._4_4_ = uVar157;
    auVar177._0_4_ = uVar157;
    auVar177._8_4_ = uVar157;
    auVar177._12_4_ = uVar157;
    local_320._16_4_ = uVar157;
    local_320._0_16_ = auVar177;
    local_320._20_4_ = uVar157;
    local_320._24_4_ = uVar157;
    local_320._28_4_ = uVar157;
    local_340 = vpermps_avx512vl(auVar95,ZEXT1632(auVar6));
    auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x908);
    local_360 = vbroadcastss_avx512vl(auVar91);
    auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0xd8c);
    local_380 = vpermps_avx512vl(auVar95,ZEXT1632(auVar91));
    uVar157 = auVar18._0_4_;
    local_3a0._4_4_ = uVar157;
    local_3a0._0_4_ = uVar157;
    fStack_398 = (float)uVar157;
    fStack_394 = (float)uVar157;
    fStack_390 = (float)uVar157;
    fStack_38c = (float)uVar157;
    fStack_388 = (float)uVar157;
    register0x0000139c = uVar157;
    _local_3c0 = vpermps_avx512vl(auVar95,ZEXT1632(auVar18));
    auVar95 = vmulps_avx512vl(_local_3a0,auVar107);
    auVar96 = vmulps_avx512vl(_local_3c0,auVar107);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar108,local_360);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar108,local_380);
    auVar89 = vfmadd231ps_fma(auVar95,auVar110,local_320);
    auVar97 = vfmadd231ps_avx512vl(auVar96,auVar110,local_340);
    auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar109,local_2e0);
    auVar197 = ZEXT3264(auVar98);
    auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar69);
    auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x484);
    auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x908);
    auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0xd8c);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar109,local_300);
    auVar194 = ZEXT3264(auVar97);
    auVar99 = vmulps_avx512vl(_local_3a0,auVar105);
    auVar100 = vmulps_avx512vl(_local_3c0,auVar105);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_360);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_380);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_320);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_340);
    auVar85 = vfmadd231ps_fma(auVar99,auVar95,local_2e0);
    auVar200 = ZEXT1664(auVar85);
    auVar81 = vfmadd231ps_fma(auVar100,auVar95,local_300);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar85),auVar98);
    auVar100 = vsubps_avx512vl(ZEXT1632(auVar81),auVar97);
    auVar101 = vmulps_avx512vl(auVar97,auVar99);
    auVar102 = vmulps_avx512vl(auVar98,auVar100);
    auVar101 = vsubps_avx512vl(auVar101,auVar102);
    auVar89 = vshufps_avx(local_5a0,local_5a0,0xff);
    uVar158 = auVar89._0_8_;
    local_80._8_8_ = uVar158;
    local_80._0_8_ = uVar158;
    local_80._16_8_ = uVar158;
    local_80._24_8_ = uVar158;
    auVar89 = vshufps_avx(local_5b0,local_5b0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar89);
    auVar89 = vshufps_avx512vl(local_5c0,local_5c0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar89);
    auVar89 = vshufps_avx512vl(_local_5d0,_local_5d0,0xff);
    uVar158 = auVar89._0_8_;
    local_e0._8_8_ = uVar158;
    local_e0._0_8_ = uVar158;
    local_e0._16_8_ = uVar158;
    local_e0._24_8_ = uVar158;
    auVar102 = vmulps_avx512vl(local_e0,auVar107);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_c0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar110,local_a0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,local_80);
    auVar103 = vmulps_avx512vl(local_e0,auVar105);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,local_c0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,local_a0);
    auVar82 = vfmadd231ps_fma(auVar103,auVar95,local_80);
    auVar103 = vmulps_avx512vl(auVar100,auVar100);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar99);
    auVar104 = vmaxps_avx512vl(auVar102,ZEXT1632(auVar82));
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar104,auVar103);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    uVar158 = vcmpps_avx512vl(auVar101,auVar103,2);
    auVar89 = vblendps_avx(auVar90,local_5a0,8);
    auVar84 = auVar218._0_16_;
    auVar92 = vandps_avx512vl(auVar89,auVar84);
    auVar89 = vblendps_avx(auVar6,local_5b0,8);
    auVar89 = vandps_avx512vl(auVar89,auVar84);
    auVar92 = vmaxps_avx(auVar92,auVar89);
    auVar89 = vblendps_avx(auVar91,local_5c0,8);
    auVar83 = vandps_avx512vl(auVar89,auVar84);
    auVar89 = vblendps_avx(auVar18,_local_5d0,8);
    auVar89 = vandps_avx512vl(auVar89,auVar84);
    auVar89 = vmaxps_avx(auVar83,auVar89);
    auVar89 = vmaxps_avx(auVar92,auVar89);
    auVar92 = vmovshdup_avx(auVar89);
    auVar92 = vmaxss_avx(auVar92,auVar89);
    auVar89 = vshufpd_avx(auVar89,auVar89,1);
    auVar89 = vmaxss_avx(auVar89,auVar92);
    auVar92 = vcvtsi2ss_avx512f(auVar84,iVar7);
    local_520._0_16_ = auVar92;
    auVar103._0_4_ = auVar92._0_4_;
    auVar103._4_4_ = auVar103._0_4_;
    auVar103._8_4_ = auVar103._0_4_;
    auVar103._12_4_ = auVar103._0_4_;
    auVar103._16_4_ = auVar103._0_4_;
    auVar103._20_4_ = auVar103._0_4_;
    auVar103._24_4_ = auVar103._0_4_;
    auVar103._28_4_ = auVar103._0_4_;
    uVar21 = vcmpps_avx512vl(auVar103,_DAT_01f7b060,0xe);
    bVar70 = (byte)uVar158 & (byte)uVar21;
    local_560 = vmulss_avx512f(auVar89,SUB6416(ZEXT464(0x35000000),0));
    auVar101._8_4_ = 2;
    auVar101._0_8_ = 0x200000002;
    auVar101._12_4_ = 2;
    auVar101._16_4_ = 2;
    auVar101._20_4_ = 2;
    auVar101._24_4_ = 2;
    auVar101._28_4_ = 2;
    local_120 = vpermps_avx2(auVar101,ZEXT1632(auVar90));
    local_140 = vpermps_avx2(auVar101,ZEXT1632(auVar6));
    local_160 = vpermps_avx2(auVar101,ZEXT1632(auVar91));
    local_180 = vpermps_avx2(auVar101,ZEXT1632(auVar18));
    local_480 = *(undefined4 *)(ray + k * 4 + 0x30);
    uStack_47c = 0;
    uStack_478 = 0;
    uStack_474 = 0;
    local_4d0 = vpbroadcastd_avx512vl();
    local_4e0 = vpbroadcastd_avx512vl();
    if (bVar70 != 0) {
      auVar105 = vmulps_avx512vl(local_180,auVar105);
      auVar106 = vfmadd213ps_avx512vl(auVar106,local_160,auVar105);
      auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar106);
      auVar105 = vfmadd213ps_avx512vl(auVar95,local_120,auVar96);
      auVar107 = vmulps_avx512vl(local_180,auVar107);
      auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar107);
      auVar96 = vfmadd213ps_avx512vl(auVar110,local_140,auVar108);
      auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x1210);
      auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x1694);
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x1b18);
      auVar95 = *(undefined1 (*) [32])(bspline_basis0 + lVar69 + 0x1f9c);
      auVar101 = vfmadd213ps_avx512vl(auVar109,local_120,auVar96);
      auVar109 = vmulps_avx512vl(_local_3a0,auVar95);
      auVar96 = vmulps_avx512vl(_local_3c0,auVar95);
      auVar95 = vmulps_avx512vl(local_180,auVar95);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar107,local_360);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar107,local_380);
      auVar107 = vfmadd231ps_avx512vl(auVar95,local_160,auVar107);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar108,local_320);
      auVar95 = vfmadd231ps_avx512vl(auVar96,auVar108,local_340);
      auVar96 = vfmadd231ps_avx512vl(auVar107,local_140,auVar108);
      auVar89 = vfmadd231ps_fma(auVar109,auVar110,local_2e0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar110,local_300);
      auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x1210);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x1b18);
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x1f9c);
      auVar96 = vfmadd231ps_avx512vl(auVar96,local_120,auVar110);
      auVar110 = vmulps_avx512vl(_local_3a0,auVar107);
      auVar106 = vmulps_avx512vl(_local_3c0,auVar107);
      auVar107 = vmulps_avx512vl(local_180,auVar107);
      auVar104 = vfmadd231ps_avx512vl(auVar110,auVar108,local_360);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_380);
      auVar108 = vfmadd231ps_avx512vl(auVar107,local_160,auVar108);
      auVar218 = ZEXT1664(auVar84);
      auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar69 + 0x1694);
      auVar107 = vfmadd231ps_avx512vl(auVar104,auVar110,local_320);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar110,local_340);
      auVar110 = vfmadd231ps_avx512vl(auVar108,local_140,auVar110);
      auVar219 = ZEXT1664(auVar219._0_16_);
      auVar92 = vfmadd231ps_fma(auVar107,auVar109,local_2e0);
      auVar108 = vfmadd231ps_avx512vl(auVar106,auVar109,local_300);
      auVar107 = vfmadd231ps_avx512vl(auVar110,local_120,auVar109);
      auVar216._8_4_ = 0x7fffffff;
      auVar216._0_8_ = 0x7fffffff7fffffff;
      auVar216._12_4_ = 0x7fffffff;
      auVar216._16_4_ = 0x7fffffff;
      auVar216._20_4_ = 0x7fffffff;
      auVar216._24_4_ = 0x7fffffff;
      auVar216._28_4_ = 0x7fffffff;
      auVar109 = vandps_avx(ZEXT1632(auVar89),auVar216);
      auVar110 = vandps_avx(auVar95,auVar216);
      auVar110 = vmaxps_avx(auVar109,auVar110);
      auVar109 = vandps_avx(auVar96,auVar216);
      auVar109 = vmaxps_avx(auVar110,auVar109);
      auVar211._4_4_ = local_560._0_4_;
      auVar211._0_4_ = local_560._0_4_;
      auVar211._8_4_ = local_560._0_4_;
      auVar211._12_4_ = local_560._0_4_;
      auVar211._16_4_ = local_560._0_4_;
      auVar211._20_4_ = local_560._0_4_;
      auVar211._24_4_ = local_560._0_4_;
      auVar211._28_4_ = local_560._0_4_;
      uVar63 = vcmpps_avx512vl(auVar109,auVar211,1);
      bVar12 = (bool)((byte)uVar63 & 1);
      auVar104._0_4_ = (float)((uint)bVar12 * auVar99._0_4_ | (uint)!bVar12 * auVar89._0_4_);
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar89._4_4_);
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar89._8_4_);
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar89._12_4_);
      fVar203 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar99._16_4_);
      auVar104._16_4_ = fVar203;
      fVar164 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar99._20_4_);
      auVar104._20_4_ = fVar164;
      fVar204 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar99._24_4_);
      auVar104._24_4_ = fVar204;
      uVar64 = (uint)(byte)(uVar63 >> 7) * auVar99._28_4_;
      auVar104._28_4_ = uVar64;
      bVar12 = (bool)((byte)uVar63 & 1);
      auVar111._0_4_ = (float)((uint)bVar12 * auVar100._0_4_ | (uint)!bVar12 * auVar95._0_4_);
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar95._4_4_);
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar95._8_4_);
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar95._12_4_);
      bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * auVar95._16_4_);
      bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * auVar95._20_4_);
      bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * auVar95._24_4_);
      bVar12 = SUB81(uVar63 >> 7,0);
      auVar111._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar95._28_4_;
      auVar109 = vandps_avx(auVar216,ZEXT1632(auVar92));
      auVar110 = vandps_avx(auVar108,auVar216);
      auVar110 = vmaxps_avx(auVar109,auVar110);
      auVar109 = vandps_avx(auVar107,auVar216);
      auVar109 = vmaxps_avx(auVar110,auVar109);
      uVar63 = vcmpps_avx512vl(auVar109,auVar211,1);
      bVar12 = (bool)((byte)uVar63 & 1);
      auVar112._0_4_ = (float)((uint)bVar12 * auVar99._0_4_ | (uint)!bVar12 * auVar92._0_4_);
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar92._4_4_);
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar92._8_4_);
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar92._12_4_);
      fVar205 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar99._16_4_);
      auVar112._16_4_ = fVar205;
      fVar163 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar99._20_4_);
      auVar112._20_4_ = fVar163;
      fVar172 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar99._24_4_);
      auVar112._24_4_ = fVar172;
      auVar112._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar99._28_4_;
      bVar12 = (bool)((byte)uVar63 & 1);
      auVar113._0_4_ = (float)((uint)bVar12 * auVar100._0_4_ | (uint)!bVar12 * auVar108._0_4_);
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar108._4_4_);
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar108._8_4_);
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar108._12_4_);
      bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar113._16_4_ = (float)((uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * auVar108._16_4_);
      bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar113._20_4_ = (float)((uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * auVar108._20_4_);
      bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar113._24_4_ = (float)((uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * auVar108._24_4_);
      bVar12 = SUB81(uVar63 >> 7,0);
      auVar113._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar108._28_4_;
      auVar87 = vxorps_avx512vl(auVar177,auVar177);
      auVar109 = vfmadd213ps_avx512vl(auVar104,auVar104,ZEXT1632(auVar87));
      auVar89 = vfmadd231ps_fma(auVar109,auVar111,auVar111);
      auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
      fVar75 = auVar108._0_4_;
      fVar76 = auVar108._4_4_;
      fVar135 = auVar108._8_4_;
      fVar136 = auVar108._12_4_;
      fVar137 = auVar108._16_4_;
      fVar138 = auVar108._20_4_;
      fVar140 = auVar108._24_4_;
      auVar109._4_4_ = fVar76 * fVar76 * fVar76 * auVar89._4_4_ * -0.5;
      auVar109._0_4_ = fVar75 * fVar75 * fVar75 * auVar89._0_4_ * -0.5;
      auVar109._8_4_ = fVar135 * fVar135 * fVar135 * auVar89._8_4_ * -0.5;
      auVar109._12_4_ = fVar136 * fVar136 * fVar136 * auVar89._12_4_ * -0.5;
      auVar109._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
      auVar109._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
      auVar109._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
      auVar109._28_4_ = 0;
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar95,auVar108);
      auVar110._4_4_ = auVar111._4_4_ * auVar109._4_4_;
      auVar110._0_4_ = auVar111._0_4_ * auVar109._0_4_;
      auVar110._8_4_ = auVar111._8_4_ * auVar109._8_4_;
      auVar110._12_4_ = auVar111._12_4_ * auVar109._12_4_;
      auVar110._16_4_ = auVar111._16_4_ * auVar109._16_4_;
      auVar110._20_4_ = auVar111._20_4_ * auVar109._20_4_;
      auVar110._24_4_ = auVar111._24_4_ * auVar109._24_4_;
      auVar110._28_4_ = auVar108._28_4_;
      auVar108._4_4_ = auVar109._4_4_ * -auVar104._4_4_;
      auVar108._0_4_ = auVar109._0_4_ * -auVar104._0_4_;
      auVar108._8_4_ = auVar109._8_4_ * -auVar104._8_4_;
      auVar108._12_4_ = auVar109._12_4_ * -auVar104._12_4_;
      auVar108._16_4_ = auVar109._16_4_ * -fVar203;
      auVar108._20_4_ = auVar109._20_4_ * -fVar164;
      auVar108._24_4_ = auVar109._24_4_ * -fVar204;
      auVar108._28_4_ = uVar64 ^ 0x80000000;
      auVar99 = vmulps_avx512vl(auVar109,ZEXT1632(auVar87));
      auVar100 = ZEXT1632(auVar87);
      auVar107 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar100);
      auVar89 = vfmadd231ps_fma(auVar107,auVar113,auVar113);
      auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
      fVar164 = auVar106._0_4_;
      fVar203 = auVar106._4_4_;
      fVar204 = auVar106._8_4_;
      fVar75 = auVar106._12_4_;
      fVar76 = auVar106._16_4_;
      fVar135 = auVar106._20_4_;
      fVar136 = auVar106._24_4_;
      auVar107._4_4_ = fVar203 * fVar203 * fVar203 * auVar89._4_4_ * -0.5;
      auVar107._0_4_ = fVar164 * fVar164 * fVar164 * auVar89._0_4_ * -0.5;
      auVar107._8_4_ = fVar204 * fVar204 * fVar204 * auVar89._8_4_ * -0.5;
      auVar107._12_4_ = fVar75 * fVar75 * fVar75 * auVar89._12_4_ * -0.5;
      auVar107._16_4_ = fVar76 * fVar76 * fVar76 * -0.0;
      auVar107._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar107._24_4_ = fVar136 * fVar136 * fVar136 * -0.0;
      auVar107._28_4_ = 0;
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar95,auVar106);
      auVar96._4_4_ = auVar113._4_4_ * auVar107._4_4_;
      auVar96._0_4_ = auVar113._0_4_ * auVar107._0_4_;
      auVar96._8_4_ = auVar113._8_4_ * auVar107._8_4_;
      auVar96._12_4_ = auVar113._12_4_ * auVar107._12_4_;
      auVar96._16_4_ = auVar113._16_4_ * auVar107._16_4_;
      auVar96._20_4_ = auVar113._20_4_ * auVar107._20_4_;
      auVar96._24_4_ = auVar113._24_4_ * auVar107._24_4_;
      auVar96._28_4_ = auVar106._28_4_;
      auVar106._4_4_ = -auVar112._4_4_ * auVar107._4_4_;
      auVar106._0_4_ = -auVar112._0_4_ * auVar107._0_4_;
      auVar106._8_4_ = -auVar112._8_4_ * auVar107._8_4_;
      auVar106._12_4_ = -auVar112._12_4_ * auVar107._12_4_;
      auVar106._16_4_ = -fVar205 * auVar107._16_4_;
      auVar106._20_4_ = -fVar163 * auVar107._20_4_;
      auVar106._24_4_ = -fVar172 * auVar107._24_4_;
      auVar106._28_4_ = auVar109._28_4_;
      auVar109 = vmulps_avx512vl(auVar107,auVar100);
      auVar89 = vfmadd213ps_fma(auVar110,auVar102,auVar98);
      auVar92 = vfmadd213ps_fma(auVar108,auVar102,auVar97);
      auVar107 = vfmadd213ps_avx512vl(auVar99,auVar102,auVar101);
      auVar95 = vfmadd213ps_avx512vl(auVar96,ZEXT1632(auVar82),ZEXT1632(auVar85));
      auVar83 = vfnmadd213ps_fma(auVar110,auVar102,auVar98);
      auVar98 = ZEXT1632(auVar82);
      auVar91 = vfmadd213ps_fma(auVar106,auVar98,ZEXT1632(auVar81));
      auVar84 = vfnmadd213ps_fma(auVar108,auVar102,auVar97);
      auVar90 = vfmadd213ps_fma(auVar109,auVar98,auVar105);
      auVar110 = vfnmadd231ps_avx512vl(auVar101,auVar102,auVar99);
      auVar85 = vfnmadd213ps_fma(auVar96,auVar98,ZEXT1632(auVar85));
      auVar81 = vfnmadd213ps_fma(auVar106,auVar98,ZEXT1632(auVar81));
      auVar86 = vfnmadd231ps_fma(auVar105,ZEXT1632(auVar82),auVar109);
      auVar108 = vsubps_avx512vl(auVar95,ZEXT1632(auVar83));
      auVar109 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar84));
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar90),auVar110);
      auVar106 = vmulps_avx512vl(auVar109,auVar110);
      auVar6 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar84),auVar96);
      auVar105._4_4_ = auVar83._4_4_ * auVar96._4_4_;
      auVar105._0_4_ = auVar83._0_4_ * auVar96._0_4_;
      auVar105._8_4_ = auVar83._8_4_ * auVar96._8_4_;
      auVar105._12_4_ = auVar83._12_4_ * auVar96._12_4_;
      auVar105._16_4_ = auVar96._16_4_ * 0.0;
      auVar105._20_4_ = auVar96._20_4_ * 0.0;
      auVar105._24_4_ = auVar96._24_4_ * 0.0;
      auVar105._28_4_ = auVar96._28_4_;
      auVar96 = vfmsub231ps_avx512vl(auVar105,auVar110,auVar108);
      auVar97._4_4_ = auVar84._4_4_ * auVar108._4_4_;
      auVar97._0_4_ = auVar84._0_4_ * auVar108._0_4_;
      auVar97._8_4_ = auVar84._8_4_ * auVar108._8_4_;
      auVar97._12_4_ = auVar84._12_4_ * auVar108._12_4_;
      auVar97._16_4_ = auVar108._16_4_ * 0.0;
      auVar97._20_4_ = auVar108._20_4_ * 0.0;
      auVar97._24_4_ = auVar108._24_4_ * 0.0;
      auVar97._28_4_ = auVar108._28_4_;
      auVar18 = vfmsub231ps_fma(auVar97,ZEXT1632(auVar83),auVar109);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),auVar100,auVar96);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar100,ZEXT1632(auVar6));
      auVar101 = ZEXT1632(auVar87);
      uVar63 = vcmpps_avx512vl(auVar109,auVar101,2);
      bVar62 = (byte)uVar63;
      fVar75 = (float)((uint)(bVar62 & 1) * auVar89._0_4_ |
                      (uint)!(bool)(bVar62 & 1) * auVar85._0_4_);
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      fVar135 = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar85._4_4_);
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      fVar137 = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar85._8_4_);
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      fVar140 = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar85._12_4_);
      auVar106 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar137,CONCAT44(fVar135,fVar75))));
      fVar76 = (float)((uint)(bVar62 & 1) * auVar92._0_4_ |
                      (uint)!(bool)(bVar62 & 1) * auVar81._0_4_);
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      fVar136 = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar81._4_4_);
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      fVar138 = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar81._8_4_);
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      fVar141 = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar81._12_4_);
      auVar105 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar138,CONCAT44(fVar136,fVar76))));
      auVar114._0_4_ =
           (float)((uint)(bVar62 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar86._0_4_);
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar86._4_4_);
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar86._8_4_);
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar86._12_4_);
      fVar204 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar107._16_4_);
      auVar114._16_4_ = fVar204;
      fVar203 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar107._20_4_);
      auVar114._20_4_ = fVar203;
      fVar164 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar107._24_4_);
      auVar114._24_4_ = fVar164;
      iVar1 = (uint)(byte)(uVar63 >> 7) * auVar107._28_4_;
      auVar114._28_4_ = iVar1;
      auVar108 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar95);
      auVar115._0_4_ =
           (uint)(bVar62 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar92._0_4_;
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar92._4_4_;
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar92._8_4_;
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar92._12_4_;
      auVar115._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar108._16_4_;
      auVar115._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar108._20_4_;
      auVar115._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar108._24_4_;
      auVar115._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar108._28_4_;
      auVar108 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar91));
      auVar116._0_4_ =
           (float)((uint)(bVar62 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar6._0_4_);
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar6._4_4_);
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar6._8_4_);
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar6._12_4_);
      fVar172 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar108._16_4_);
      auVar116._16_4_ = fVar172;
      fVar163 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar108._20_4_);
      auVar116._20_4_ = fVar163;
      fVar205 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar108._24_4_);
      auVar116._24_4_ = fVar205;
      auVar116._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar108._28_4_;
      auVar108 = vblendmps_avx512vl(auVar110,ZEXT1632(auVar90));
      auVar117._0_4_ =
           (float)((uint)(bVar62 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar107._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar107._4_4_);
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar107._8_4_);
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar107._12_4_);
      bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar117._16_4_ = (float)((uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * auVar107._16_4_);
      bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar117._20_4_ = (float)((uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * auVar107._20_4_);
      bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar117._24_4_ = (float)((uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * auVar107._24_4_);
      bVar12 = SUB81(uVar63 >> 7,0);
      auVar117._28_4_ = (uint)bVar12 * auVar108._28_4_ | (uint)!bVar12 * auVar107._28_4_;
      auVar118._0_4_ =
           (uint)(bVar62 & 1) * (int)auVar83._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar95._0_4_;
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar12 * (int)auVar83._4_4_ | (uint)!bVar12 * auVar95._4_4_;
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar12 * (int)auVar83._8_4_ | (uint)!bVar12 * auVar95._8_4_;
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar12 * (int)auVar83._12_4_ | (uint)!bVar12 * auVar95._12_4_;
      auVar118._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar95._16_4_;
      auVar118._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar95._20_4_;
      auVar118._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar95._24_4_;
      auVar118._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar95._28_4_;
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar63 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar119._0_4_ =
           (uint)(bVar62 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar90._0_4_;
      bVar13 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar90._4_4_;
      bVar13 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar90._8_4_;
      bVar13 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar90._12_4_;
      auVar119._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar110._16_4_;
      auVar119._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar110._20_4_;
      auVar119._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar110._24_4_;
      iVar2 = (uint)(byte)(uVar63 >> 7) * auVar110._28_4_;
      auVar119._28_4_ = iVar2;
      auVar97 = vsubps_avx512vl(auVar118,auVar106);
      auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar84._12_4_ |
                                               (uint)!bVar15 * auVar91._12_4_,
                                               CONCAT48((uint)bVar14 * (int)auVar84._8_4_ |
                                                        (uint)!bVar14 * auVar91._8_4_,
                                                        CONCAT44((uint)bVar12 * (int)auVar84._4_4_ |
                                                                 (uint)!bVar12 * auVar91._4_4_,
                                                                 (uint)(bVar62 & 1) *
                                                                 (int)auVar84._0_4_ |
                                                                 (uint)!(bool)(bVar62 & 1) *
                                                                 auVar91._0_4_)))),auVar105);
      auVar197 = ZEXT3264(auVar110);
      auVar108 = vsubps_avx(auVar119,auVar114);
      auVar107 = vsubps_avx(auVar106,auVar115);
      auVar200 = ZEXT3264(auVar107);
      auVar95 = vsubps_avx(auVar105,auVar116);
      auVar96 = vsubps_avx(auVar114,auVar117);
      auVar98._4_4_ = auVar108._4_4_ * fVar135;
      auVar98._0_4_ = auVar108._0_4_ * fVar75;
      auVar98._8_4_ = auVar108._8_4_ * fVar137;
      auVar98._12_4_ = auVar108._12_4_ * fVar140;
      auVar98._16_4_ = auVar108._16_4_ * 0.0;
      auVar98._20_4_ = auVar108._20_4_ * 0.0;
      auVar98._24_4_ = auVar108._24_4_ * 0.0;
      auVar98._28_4_ = iVar2;
      auVar89 = vfmsub231ps_fma(auVar98,auVar114,auVar97);
      auVar99._4_4_ = fVar136 * auVar97._4_4_;
      auVar99._0_4_ = fVar76 * auVar97._0_4_;
      auVar99._8_4_ = fVar138 * auVar97._8_4_;
      auVar99._12_4_ = fVar141 * auVar97._12_4_;
      auVar99._16_4_ = auVar97._16_4_ * 0.0;
      auVar99._20_4_ = auVar97._20_4_ * 0.0;
      auVar99._24_4_ = auVar97._24_4_ * 0.0;
      auVar99._28_4_ = auVar109._28_4_;
      auVar92 = vfmsub231ps_fma(auVar99,auVar106,auVar110);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar101,ZEXT1632(auVar89));
      auVar190._0_4_ = auVar110._0_4_ * auVar114._0_4_;
      auVar190._4_4_ = auVar110._4_4_ * auVar114._4_4_;
      auVar190._8_4_ = auVar110._8_4_ * auVar114._8_4_;
      auVar190._12_4_ = auVar110._12_4_ * auVar114._12_4_;
      auVar190._16_4_ = auVar110._16_4_ * fVar204;
      auVar190._20_4_ = auVar110._20_4_ * fVar203;
      auVar190._24_4_ = auVar110._24_4_ * fVar164;
      auVar190._28_4_ = 0;
      auVar89 = vfmsub231ps_fma(auVar190,auVar105,auVar108);
      auVar98 = vfmadd231ps_avx512vl(auVar109,auVar101,ZEXT1632(auVar89));
      auVar109 = vmulps_avx512vl(auVar96,auVar115);
      auVar109 = vfmsub231ps_avx512vl(auVar109,auVar107,auVar117);
      auVar100._4_4_ = auVar95._4_4_ * auVar117._4_4_;
      auVar100._0_4_ = auVar95._0_4_ * auVar117._0_4_;
      auVar100._8_4_ = auVar95._8_4_ * auVar117._8_4_;
      auVar100._12_4_ = auVar95._12_4_ * auVar117._12_4_;
      auVar100._16_4_ = auVar95._16_4_ * auVar117._16_4_;
      auVar100._20_4_ = auVar95._20_4_ * auVar117._20_4_;
      auVar100._24_4_ = auVar95._24_4_ * auVar117._24_4_;
      auVar100._28_4_ = auVar117._28_4_;
      auVar89 = vfmsub231ps_fma(auVar100,auVar116,auVar96);
      auVar191._0_4_ = auVar116._0_4_ * auVar107._0_4_;
      auVar191._4_4_ = auVar116._4_4_ * auVar107._4_4_;
      auVar191._8_4_ = auVar116._8_4_ * auVar107._8_4_;
      auVar191._12_4_ = auVar116._12_4_ * auVar107._12_4_;
      auVar191._16_4_ = fVar172 * auVar107._16_4_;
      auVar191._20_4_ = fVar163 * auVar107._20_4_;
      auVar191._24_4_ = fVar205 * auVar107._24_4_;
      auVar191._28_4_ = 0;
      auVar92 = vfmsub231ps_fma(auVar191,auVar95,auVar115);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar101,auVar109);
      auVar99 = vfmadd231ps_avx512vl(auVar109,auVar101,ZEXT1632(auVar89));
      auVar194 = ZEXT3264(auVar99);
      auVar109 = vmaxps_avx(auVar98,auVar99);
      uVar158 = vcmpps_avx512vl(auVar109,auVar101,2);
      bVar70 = bVar70 & (byte)uVar158;
      if (bVar70 != 0) {
        auVar35._4_4_ = auVar96._4_4_ * auVar110._4_4_;
        auVar35._0_4_ = auVar96._0_4_ * auVar110._0_4_;
        auVar35._8_4_ = auVar96._8_4_ * auVar110._8_4_;
        auVar35._12_4_ = auVar96._12_4_ * auVar110._12_4_;
        auVar35._16_4_ = auVar96._16_4_ * auVar110._16_4_;
        auVar35._20_4_ = auVar96._20_4_ * auVar110._20_4_;
        auVar35._24_4_ = auVar96._24_4_ * auVar110._24_4_;
        auVar35._28_4_ = auVar109._28_4_;
        auVar90 = vfmsub231ps_fma(auVar35,auVar95,auVar108);
        auVar36._4_4_ = auVar108._4_4_ * auVar107._4_4_;
        auVar36._0_4_ = auVar108._0_4_ * auVar107._0_4_;
        auVar36._8_4_ = auVar108._8_4_ * auVar107._8_4_;
        auVar36._12_4_ = auVar108._12_4_ * auVar107._12_4_;
        auVar36._16_4_ = auVar108._16_4_ * auVar107._16_4_;
        auVar36._20_4_ = auVar108._20_4_ * auVar107._20_4_;
        auVar36._24_4_ = auVar108._24_4_ * auVar107._24_4_;
        auVar36._28_4_ = auVar108._28_4_;
        auVar91 = vfmsub231ps_fma(auVar36,auVar97,auVar96);
        auVar37._4_4_ = auVar95._4_4_ * auVar97._4_4_;
        auVar37._0_4_ = auVar95._0_4_ * auVar97._0_4_;
        auVar37._8_4_ = auVar95._8_4_ * auVar97._8_4_;
        auVar37._12_4_ = auVar95._12_4_ * auVar97._12_4_;
        auVar37._16_4_ = auVar95._16_4_ * auVar97._16_4_;
        auVar37._20_4_ = auVar95._20_4_ * auVar97._20_4_;
        auVar37._24_4_ = auVar95._24_4_ * auVar97._24_4_;
        auVar37._28_4_ = auVar95._28_4_;
        auVar6 = vfmsub231ps_fma(auVar37,auVar107,auVar110);
        auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar6));
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar90),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar109 = vrcp14ps_avx512vl(ZEXT1632(auVar92));
        auVar28._8_4_ = 0x3f800000;
        auVar28._0_8_ = 0x3f8000003f800000;
        auVar28._12_4_ = 0x3f800000;
        auVar28._16_4_ = 0x3f800000;
        auVar28._20_4_ = 0x3f800000;
        auVar28._24_4_ = 0x3f800000;
        auVar28._28_4_ = 0x3f800000;
        auVar110 = vfnmadd213ps_avx512vl(auVar109,ZEXT1632(auVar92),auVar28);
        auVar89 = vfmadd132ps_fma(auVar110,auVar109,auVar109);
        auVar197 = ZEXT1664(auVar89);
        auVar38._4_4_ = auVar6._4_4_ * auVar114._4_4_;
        auVar38._0_4_ = auVar6._0_4_ * auVar114._0_4_;
        auVar38._8_4_ = auVar6._8_4_ * auVar114._8_4_;
        auVar38._12_4_ = auVar6._12_4_ * auVar114._12_4_;
        auVar38._16_4_ = fVar204 * 0.0;
        auVar38._20_4_ = fVar203 * 0.0;
        auVar38._24_4_ = fVar164 * 0.0;
        auVar38._28_4_ = iVar1;
        auVar91 = vfmadd231ps_fma(auVar38,auVar105,ZEXT1632(auVar91));
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar106,ZEXT1632(auVar90));
        fVar164 = auVar89._0_4_;
        fVar203 = auVar89._4_4_;
        fVar204 = auVar89._8_4_;
        fVar205 = auVar89._12_4_;
        local_4c0._28_4_ = auVar109._28_4_;
        local_4c0._0_28_ =
             ZEXT1628(CONCAT412(auVar91._12_4_ * fVar205,
                                CONCAT48(auVar91._8_4_ * fVar204,
                                         CONCAT44(auVar91._4_4_ * fVar203,auVar91._0_4_ * fVar164)))
                     );
        auVar200 = ZEXT3264(local_4c0);
        auVar149._4_4_ = local_480;
        auVar149._0_4_ = local_480;
        auVar149._8_4_ = local_480;
        auVar149._12_4_ = local_480;
        auVar149._16_4_ = local_480;
        auVar149._20_4_ = local_480;
        auVar149._24_4_ = local_480;
        auVar149._28_4_ = local_480;
        uVar158 = vcmpps_avx512vl(auVar149,local_4c0,2);
        uVar157 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar29._4_4_ = uVar157;
        auVar29._0_4_ = uVar157;
        auVar29._8_4_ = uVar157;
        auVar29._12_4_ = uVar157;
        auVar29._16_4_ = uVar157;
        auVar29._20_4_ = uVar157;
        auVar29._24_4_ = uVar157;
        auVar29._28_4_ = uVar157;
        uVar21 = vcmpps_avx512vl(local_4c0,auVar29,2);
        bVar70 = (byte)uVar158 & (byte)uVar21 & bVar70;
        if (bVar70 != 0) {
          uVar72 = vcmpps_avx512vl(ZEXT1632(auVar92),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar72 = bVar70 & uVar72;
          if ((char)uVar72 != '\0') {
            fVar163 = auVar98._0_4_ * fVar164;
            fVar172 = auVar98._4_4_ * fVar203;
            auVar39._4_4_ = fVar172;
            auVar39._0_4_ = fVar163;
            fVar75 = auVar98._8_4_ * fVar204;
            auVar39._8_4_ = fVar75;
            fVar76 = auVar98._12_4_ * fVar205;
            auVar39._12_4_ = fVar76;
            fVar135 = auVar98._16_4_ * 0.0;
            auVar39._16_4_ = fVar135;
            fVar136 = auVar98._20_4_ * 0.0;
            auVar39._20_4_ = fVar136;
            fVar137 = auVar98._24_4_ * 0.0;
            auVar39._24_4_ = fVar137;
            auVar39._28_4_ = auVar98._28_4_;
            auVar150._8_4_ = 0x3f800000;
            auVar150._0_8_ = 0x3f8000003f800000;
            auVar150._12_4_ = 0x3f800000;
            auVar150._16_4_ = 0x3f800000;
            auVar150._20_4_ = 0x3f800000;
            auVar150._24_4_ = 0x3f800000;
            auVar150._28_4_ = 0x3f800000;
            auVar109 = vsubps_avx(auVar150,auVar39);
            local_2c0._0_4_ =
                 (float)((uint)(bVar62 & 1) * (int)fVar163 |
                        (uint)!(bool)(bVar62 & 1) * auVar109._0_4_);
            bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
            local_2c0._4_4_ = (float)((uint)bVar12 * (int)fVar172 | (uint)!bVar12 * auVar109._4_4_);
            bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
            local_2c0._8_4_ = (float)((uint)bVar12 * (int)fVar75 | (uint)!bVar12 * auVar109._8_4_);
            bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
            local_2c0._12_4_ = (float)((uint)bVar12 * (int)fVar76 | (uint)!bVar12 * auVar109._12_4_)
            ;
            bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
            local_2c0._16_4_ =
                 (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar109._16_4_);
            bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
            local_2c0._20_4_ =
                 (float)((uint)bVar12 * (int)fVar136 | (uint)!bVar12 * auVar109._20_4_);
            bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
            local_2c0._24_4_ =
                 (float)((uint)bVar12 * (int)fVar137 | (uint)!bVar12 * auVar109._24_4_);
            bVar12 = SUB81(uVar63 >> 7,0);
            local_2c0._28_4_ =
                 (float)((uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar109._28_4_);
            auVar109 = vsubps_avx(ZEXT1632(auVar82),auVar102);
            auVar89 = vfmadd213ps_fma(auVar109,local_2c0,auVar102);
            uVar157 = *(undefined4 *)((long)local_540->ray_space + k * 4 + -0x10);
            auVar102._4_4_ = uVar157;
            auVar102._0_4_ = uVar157;
            auVar102._8_4_ = uVar157;
            auVar102._12_4_ = uVar157;
            auVar102._16_4_ = uVar157;
            auVar102._20_4_ = uVar157;
            auVar102._24_4_ = uVar157;
            auVar102._28_4_ = uVar157;
            auVar109 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                          CONCAT48(auVar89._8_4_ + auVar89._8_4_,
                                                                   CONCAT44(auVar89._4_4_ +
                                                                            auVar89._4_4_,
                                                                            auVar89._0_4_ +
                                                                            auVar89._0_4_)))),
                                       auVar102);
            uVar74 = vcmpps_avx512vl(local_4c0,auVar109,6);
            uVar72 = uVar72 & uVar74;
            bVar70 = (byte)uVar72;
            if (bVar70 != 0) {
              auVar170._0_4_ = auVar99._0_4_ * fVar164;
              auVar170._4_4_ = auVar99._4_4_ * fVar203;
              auVar170._8_4_ = auVar99._8_4_ * fVar204;
              auVar170._12_4_ = auVar99._12_4_ * fVar205;
              auVar170._16_4_ = auVar99._16_4_ * 0.0;
              auVar170._20_4_ = auVar99._20_4_ * 0.0;
              auVar170._24_4_ = auVar99._24_4_ * 0.0;
              auVar170._28_4_ = 0;
              auVar178._8_4_ = 0x3f800000;
              auVar178._0_8_ = 0x3f8000003f800000;
              auVar178._12_4_ = 0x3f800000;
              auVar178._16_4_ = 0x3f800000;
              auVar178._20_4_ = 0x3f800000;
              auVar178._24_4_ = 0x3f800000;
              auVar178._28_4_ = 0x3f800000;
              auVar109 = vsubps_avx(auVar178,auVar170);
              auVar120._0_4_ =
                   (uint)(bVar62 & 1) * (int)auVar170._0_4_ |
                   (uint)!(bool)(bVar62 & 1) * auVar109._0_4_;
              bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
              auVar120._4_4_ = (uint)bVar12 * (int)auVar170._4_4_ | (uint)!bVar12 * auVar109._4_4_;
              bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
              auVar120._8_4_ = (uint)bVar12 * (int)auVar170._8_4_ | (uint)!bVar12 * auVar109._8_4_;
              bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
              auVar120._12_4_ =
                   (uint)bVar12 * (int)auVar170._12_4_ | (uint)!bVar12 * auVar109._12_4_;
              bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
              auVar120._16_4_ =
                   (uint)bVar12 * (int)auVar170._16_4_ | (uint)!bVar12 * auVar109._16_4_;
              bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
              auVar120._20_4_ =
                   (uint)bVar12 * (int)auVar170._20_4_ | (uint)!bVar12 * auVar109._20_4_;
              bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
              auVar120._24_4_ =
                   (uint)bVar12 * (int)auVar170._24_4_ | (uint)!bVar12 * auVar109._24_4_;
              auVar120._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar109._28_4_;
              auVar30._8_4_ = 0x40000000;
              auVar30._0_8_ = 0x4000000040000000;
              auVar30._12_4_ = 0x40000000;
              auVar30._16_4_ = 0x40000000;
              auVar30._20_4_ = 0x40000000;
              auVar30._24_4_ = 0x40000000;
              auVar30._28_4_ = 0x40000000;
              local_2a0 = vfmsub132ps_avx512vl(auVar120,auVar178,auVar30);
              local_280 = local_4c0;
              local_260 = 0;
              local_25c = iVar7;
              local_250 = local_5a0._0_8_;
              uStack_248 = local_5a0._8_8_;
              local_240 = local_5b0._0_8_;
              uStack_238 = local_5b0._8_8_;
              local_230 = local_5c0._0_8_;
              uStack_228 = local_5c0._8_8_;
              local_220 = local_5d0;
              uStack_218 = uStack_5c8;
              if ((pGVar68->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar164 = 1.0 / auVar103._0_4_;
                local_200[0] = fVar164 * (local_2c0._0_4_ + 0.0);
                local_200[1] = fVar164 * (local_2c0._4_4_ + 1.0);
                local_200[2] = fVar164 * (local_2c0._8_4_ + 2.0);
                local_200[3] = fVar164 * (local_2c0._12_4_ + 3.0);
                fStack_1f0 = fVar164 * (local_2c0._16_4_ + 4.0);
                fStack_1ec = fVar164 * (local_2c0._20_4_ + 5.0);
                fStack_1e8 = fVar164 * (local_2c0._24_4_ + 6.0);
                fStack_1e4 = local_2c0._28_4_ + 7.0;
                local_1e0 = local_2a0;
                local_1c0 = local_4c0;
                auVar151._8_4_ = 0x7f800000;
                auVar151._0_8_ = 0x7f8000007f800000;
                auVar151._12_4_ = 0x7f800000;
                auVar151._16_4_ = 0x7f800000;
                auVar151._20_4_ = 0x7f800000;
                auVar151._24_4_ = 0x7f800000;
                auVar151._28_4_ = 0x7f800000;
                auVar109 = vblendmps_avx512vl(auVar151,local_4c0);
                auVar121._0_4_ =
                     (uint)(bVar70 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
                auVar121._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                auVar121._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
                auVar121._12_4_ = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 4) & 1);
                auVar121._16_4_ = (uint)bVar12 * auVar109._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 5) & 1);
                auVar121._20_4_ = (uint)bVar12 * auVar109._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                auVar121._24_4_ = (uint)bVar12 * auVar109._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar72 >> 7,0);
                auVar121._28_4_ = (uint)bVar12 * auVar109._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar109 = vshufps_avx(auVar121,auVar121,0xb1);
                auVar109 = vminps_avx(auVar121,auVar109);
                auVar110 = vshufpd_avx(auVar109,auVar109,5);
                auVar109 = vminps_avx(auVar109,auVar110);
                auVar110 = vpermpd_avx2(auVar109,0x4e);
                auVar109 = vminps_avx(auVar109,auVar110);
                uVar158 = vcmpps_avx512vl(auVar121,auVar109,0);
                uVar64 = (uint)uVar72;
                if ((bVar70 & (byte)uVar158) != 0) {
                  uVar64 = (uint)(bVar70 & (byte)uVar158);
                }
                uVar22 = 0;
                for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
                  uVar22 = uVar22 + 1;
                }
                uVar63 = (ulong)uVar22;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar68->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_4a0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  do {
                    fVar164 = local_200[uVar63];
                    local_420._4_4_ = fVar164;
                    local_420._0_4_ = fVar164;
                    local_420._8_4_ = fVar164;
                    local_420._12_4_ = fVar164;
                    local_410 = *(undefined4 *)(local_1e0 + uVar63 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar63 * 4);
                    local_590.context = context->user;
                    fVar203 = 1.0 - fVar164;
                    auVar27._8_4_ = 0x80000000;
                    auVar27._0_8_ = 0x8000000080000000;
                    auVar27._12_4_ = 0x80000000;
                    auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar203),auVar27);
                    auVar89 = ZEXT416((uint)(fVar164 * fVar203 * 4.0));
                    auVar92 = vfnmsub213ss_fma(local_420,local_420,auVar89);
                    auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),auVar89)
                    ;
                    fVar203 = fVar203 * auVar91._0_4_ * 0.5;
                    fVar204 = auVar92._0_4_ * 0.5;
                    auVar197 = ZEXT464((uint)fVar204);
                    fVar205 = auVar89._0_4_ * 0.5;
                    fVar164 = fVar164 * fVar164 * 0.5;
                    auVar188._0_4_ = fVar164 * (float)local_5d0._0_4_;
                    auVar188._4_4_ = fVar164 * (float)local_5d0._4_4_;
                    auVar188._8_4_ = fVar164 * (float)uStack_5c8;
                    auVar188._12_4_ = fVar164 * uStack_5c8._4_4_;
                    auVar147._4_4_ = fVar205;
                    auVar147._0_4_ = fVar205;
                    auVar147._8_4_ = fVar205;
                    auVar147._12_4_ = fVar205;
                    auVar89 = vfmadd132ps_fma(auVar147,auVar188,local_5c0);
                    auVar189._4_4_ = fVar204;
                    auVar189._0_4_ = fVar204;
                    auVar189._8_4_ = fVar204;
                    auVar189._12_4_ = fVar204;
                    auVar89 = vfmadd132ps_fma(auVar189,auVar89,local_5b0);
                    auVar148._4_4_ = fVar203;
                    auVar148._0_4_ = fVar203;
                    auVar148._8_4_ = fVar203;
                    auVar148._12_4_ = fVar203;
                    auVar89 = vfmadd132ps_fma(auVar148,auVar89,local_5a0);
                    local_450 = auVar89._0_4_;
                    local_440 = vshufps_avx(auVar89,auVar89,0x55);
                    auVar194 = ZEXT1664(local_440);
                    local_430 = vshufps_avx(auVar89,auVar89,0xaa);
                    iStack_44c = local_450;
                    iStack_448 = local_450;
                    iStack_444 = local_450;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    local_400 = local_4e0._0_8_;
                    uStack_3f8 = local_4e0._8_8_;
                    local_3f0 = local_4d0;
                    vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                    uStack_3dc = (local_590.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_590.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_5f0 = local_4f0;
                    local_590.valid = (int *)local_5f0;
                    local_590.geometryUserPtr = pGVar68->userPtr;
                    local_590.hit = (RTCHitN *)&local_450;
                    local_590.N = 4;
                    local_590.ray = (RTCRayN *)ray;
                    if (pGVar68->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar194 = ZEXT1664(local_440);
                      auVar197 = ZEXT464((uint)fVar204);
                      (*pGVar68->intersectionFilterN)(&local_590);
                      auVar200 = ZEXT3264(local_4c0);
                      auVar219 = ZEXT464(0xbf800000);
                      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar218 = ZEXT1664(auVar89);
                    }
                    uVar74 = vptestmd_avx512vl(local_5f0,local_5f0);
                    if ((uVar74 & 0xf) == 0) {
LAB_018e6469:
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_4a0._0_4_;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar68->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar194 = ZEXT1664(auVar194._0_16_);
                        auVar197 = ZEXT1664(auVar197._0_16_);
                        (*p_Var11)(&local_590);
                        auVar200 = ZEXT3264(local_4c0);
                        auVar219 = ZEXT464(0xbf800000);
                        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar218 = ZEXT1664(auVar89);
                      }
                      uVar74 = vptestmd_avx512vl(local_5f0,local_5f0);
                      uVar74 = uVar74 & 0xf;
                      bVar70 = (byte)uVar74;
                      if (bVar70 == 0) goto LAB_018e6469;
                      iVar1 = *(int *)(local_590.hit + 4);
                      iVar2 = *(int *)(local_590.hit + 8);
                      iVar60 = *(int *)(local_590.hit + 0xc);
                      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar14 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_590.ray + 0xc0) =
                           (uint)(bVar70 & 1) * *(int *)local_590.hit |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_590.ray + 0xc0);
                      *(uint *)(local_590.ray + 0xc4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xc4);
                      *(uint *)(local_590.ray + 200) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 200);
                      *(uint *)(local_590.ray + 0xcc) =
                           (uint)bVar14 * iVar60 | (uint)!bVar14 * *(int *)(local_590.ray + 0xcc);
                      iVar1 = *(int *)(local_590.hit + 0x14);
                      iVar2 = *(int *)(local_590.hit + 0x18);
                      iVar60 = *(int *)(local_590.hit + 0x1c);
                      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar14 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_590.ray + 0xd0) =
                           (uint)(bVar70 & 1) * *(int *)(local_590.hit + 0x10) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_590.ray + 0xd0);
                      *(uint *)(local_590.ray + 0xd4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xd4);
                      *(uint *)(local_590.ray + 0xd8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xd8);
                      *(uint *)(local_590.ray + 0xdc) =
                           (uint)bVar14 * iVar60 | (uint)!bVar14 * *(int *)(local_590.ray + 0xdc);
                      iVar1 = *(int *)(local_590.hit + 0x24);
                      iVar2 = *(int *)(local_590.hit + 0x28);
                      iVar60 = *(int *)(local_590.hit + 0x2c);
                      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar14 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_590.ray + 0xe0) =
                           (uint)(bVar70 & 1) * *(int *)(local_590.hit + 0x20) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_590.ray + 0xe0);
                      *(uint *)(local_590.ray + 0xe4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xe4);
                      *(uint *)(local_590.ray + 0xe8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xe8);
                      *(uint *)(local_590.ray + 0xec) =
                           (uint)bVar14 * iVar60 | (uint)!bVar14 * *(int *)(local_590.ray + 0xec);
                      iVar1 = *(int *)(local_590.hit + 0x34);
                      iVar2 = *(int *)(local_590.hit + 0x38);
                      iVar60 = *(int *)(local_590.hit + 0x3c);
                      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar14 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_590.ray + 0xf0) =
                           (uint)(bVar70 & 1) * *(int *)(local_590.hit + 0x30) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_590.ray + 0xf0);
                      *(uint *)(local_590.ray + 0xf4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xf4);
                      *(uint *)(local_590.ray + 0xf8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xf8);
                      *(uint *)(local_590.ray + 0xfc) =
                           (uint)bVar14 * iVar60 | (uint)!bVar14 * *(int *)(local_590.ray + 0xfc);
                      iVar1 = *(int *)(local_590.hit + 0x44);
                      iVar2 = *(int *)(local_590.hit + 0x48);
                      iVar60 = *(int *)(local_590.hit + 0x4c);
                      bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar14 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_590.ray + 0x100) =
                           (uint)(bVar70 & 1) * *(int *)(local_590.hit + 0x40) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_590.ray + 0x100);
                      *(uint *)(local_590.ray + 0x104) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0x104);
                      *(uint *)(local_590.ray + 0x108) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0x108);
                      *(uint *)(local_590.ray + 0x10c) =
                           (uint)bVar14 * iVar60 | (uint)!bVar14 * *(int *)(local_590.ray + 0x10c);
                      auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
                      *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar89;
                      auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
                      *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar89;
                      auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
                      *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar89;
                      auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
                      *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar89;
                      local_4a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_4a0._4_4_ = 0;
                      local_4a0._8_4_ = 0;
                      local_4a0._12_4_ = 0;
                    }
                    bVar70 = ~(byte)(1 << ((uint)uVar63 & 0x1f)) & (byte)uVar72;
                    auVar155._4_4_ = local_4a0._0_4_;
                    auVar155._0_4_ = local_4a0._0_4_;
                    auVar155._8_4_ = local_4a0._0_4_;
                    auVar155._12_4_ = local_4a0._0_4_;
                    auVar155._16_4_ = local_4a0._0_4_;
                    auVar155._20_4_ = local_4a0._0_4_;
                    auVar155._24_4_ = local_4a0._0_4_;
                    auVar155._28_4_ = local_4a0._0_4_;
                    uVar158 = vcmpps_avx512vl(auVar200._0_32_,auVar155,2);
                    prim = local_5e0;
                    if ((bVar70 & (byte)uVar158) == 0) goto LAB_018e5428;
                    bVar70 = bVar70 & (byte)uVar158;
                    uVar72 = (ulong)bVar70;
                    auVar156._8_4_ = 0x7f800000;
                    auVar156._0_8_ = 0x7f8000007f800000;
                    auVar156._12_4_ = 0x7f800000;
                    auVar156._16_4_ = 0x7f800000;
                    auVar156._20_4_ = 0x7f800000;
                    auVar156._24_4_ = 0x7f800000;
                    auVar156._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar156,auVar200._0_32_);
                    auVar134._0_4_ =
                         (uint)(bVar70 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar70 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar70 >> 1 & 1);
                    auVar134._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar70 >> 2 & 1);
                    auVar134._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar70 >> 3 & 1);
                    auVar134._12_4_ = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar70 >> 4 & 1);
                    auVar134._16_4_ = (uint)bVar12 * auVar109._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar70 >> 5 & 1);
                    auVar134._20_4_ = (uint)bVar12 * auVar109._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar70 >> 6 & 1);
                    auVar134._24_4_ = (uint)bVar12 * auVar109._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar134._28_4_ =
                         (uint)(bVar70 >> 7) * auVar109._28_4_ |
                         (uint)!(bool)(bVar70 >> 7) * 0x7f800000;
                    auVar109 = vshufps_avx(auVar134,auVar134,0xb1);
                    auVar109 = vminps_avx(auVar134,auVar109);
                    auVar110 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    auVar110 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    uVar158 = vcmpps_avx512vl(auVar134,auVar109,0);
                    bVar62 = (byte)uVar158 & bVar70;
                    if (bVar62 != 0) {
                      bVar70 = bVar62;
                    }
                    uVar71 = 0;
                    for (uVar65 = (uint)bVar70; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000
                        ) {
                      uVar71 = uVar71 + 1;
                    }
                    uVar63 = (ulong)uVar71;
                  } while( true );
                }
                fVar164 = local_200[uVar63];
                uVar157 = *(undefined4 *)(local_1e0 + uVar63 * 4);
                fVar203 = 1.0 - fVar164;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar203),auVar23);
                auVar89 = ZEXT416((uint)(fVar164 * fVar203 * 4.0));
                auVar92 = vfnmsub213ss_fma(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),auVar89);
                auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),auVar89);
                fVar203 = fVar203 * auVar91._0_4_ * 0.5;
                fVar204 = auVar92._0_4_ * 0.5;
                auVar197 = ZEXT464((uint)fVar204);
                fVar205 = auVar89._0_4_ * 0.5;
                fVar163 = fVar164 * fVar164 * 0.5;
                auVar182._0_4_ = fVar163 * (float)local_5d0._0_4_;
                auVar182._4_4_ = fVar163 * (float)local_5d0._4_4_;
                auVar182._8_4_ = fVar163 * (float)uStack_5c8;
                auVar182._12_4_ = fVar163 * uStack_5c8._4_4_;
                auVar166._4_4_ = fVar205;
                auVar166._0_4_ = fVar205;
                auVar166._8_4_ = fVar205;
                auVar166._12_4_ = fVar205;
                auVar89 = vfmadd132ps_fma(auVar166,auVar182,local_5c0);
                auVar183._4_4_ = fVar204;
                auVar183._0_4_ = fVar204;
                auVar183._8_4_ = fVar204;
                auVar183._12_4_ = fVar204;
                auVar89 = vfmadd132ps_fma(auVar183,auVar89,local_5b0);
                auVar194 = ZEXT1664(auVar89);
                auVar167._4_4_ = fVar203;
                auVar167._0_4_ = fVar203;
                auVar167._8_4_ = fVar203;
                auVar167._12_4_ = fVar203;
                auVar89 = vfmadd132ps_fma(auVar167,auVar89,local_5a0);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar63 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar89._0_4_;
                uVar8 = vextractps_avx(auVar89,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                uVar8 = vextractps_avx(auVar89,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar8;
                *(float *)(ray + k * 4 + 0xf0) = fVar164;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar157;
                *(uint *)(ray + k * 4 + 0x110) = uVar65;
                *(uint *)(ray + k * 4 + 0x120) = uVar71;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                prim = local_5e0;
              }
            }
          }
        }
      }
    }
LAB_018e5428:
    if (8 < iVar7) {
      local_4a0 = vpbroadcastd_avx512vl();
      local_4c0._4_4_ = local_560._0_4_;
      local_4c0._0_4_ = local_560._0_4_;
      local_4c0._8_4_ = local_560._0_4_;
      local_4c0._12_4_ = local_560._0_4_;
      local_4c0._16_4_ = local_560._0_4_;
      local_4c0._20_4_ = local_560._0_4_;
      local_4c0._24_4_ = local_560._0_4_;
      local_4c0._28_4_ = local_560._0_4_;
      uStack_47c = local_480;
      uStack_478 = local_480;
      uStack_474 = local_480;
      uStack_470 = local_480;
      uStack_46c = local_480;
      uStack_468 = local_480;
      uStack_464 = local_480;
      local_100 = 1.0 / (float)local_520._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar66 = 8;
LAB_018e54b8:
      if (lVar66 < iVar7) {
        auVar109 = vpbroadcastd_avx512vl();
        auVar109 = vpor_avx2(auVar109,_DAT_01fb4ba0);
        uVar21 = vpcmpd_avx512vl(auVar109,local_4a0,1);
        auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar66 * 4 + lVar69);
        auVar110 = *(undefined1 (*) [32])(lVar69 + 0x21fffac + lVar66 * 4);
        auVar108 = *(undefined1 (*) [32])(lVar69 + 0x2200430 + lVar66 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar69 + 0x22008b4 + lVar66 * 4);
        fVar164 = auVar107._0_4_;
        auVar198._0_4_ = fVar164 * (float)local_3a0._0_4_;
        fVar203 = auVar107._4_4_;
        auVar198._4_4_ = fVar203 * (float)local_3a0._4_4_;
        fVar204 = auVar107._8_4_;
        auVar198._8_4_ = fVar204 * fStack_398;
        fVar205 = auVar107._12_4_;
        auVar198._12_4_ = fVar205 * fStack_394;
        fVar163 = auVar107._16_4_;
        auVar198._16_4_ = fVar163 * fStack_390;
        fVar172 = auVar107._20_4_;
        auVar198._20_4_ = fVar172 * fStack_38c;
        auVar198._28_36_ = auVar197._28_36_;
        fVar75 = auVar107._24_4_;
        auVar198._24_4_ = fVar75 * fStack_388;
        auVar197._0_4_ = fVar164 * (float)local_3c0._0_4_;
        auVar197._4_4_ = fVar203 * (float)local_3c0._4_4_;
        auVar197._8_4_ = fVar204 * fStack_3b8;
        auVar197._12_4_ = fVar205 * fStack_3b4;
        auVar197._16_4_ = fVar163 * fStack_3b0;
        auVar197._20_4_ = fVar172 * fStack_3ac;
        auVar197._28_36_ = auVar194._28_36_;
        auVar197._24_4_ = fVar75 * fStack_3a8;
        auVar95 = vmulps_avx512vl(local_e0,auVar107);
        auVar96 = vfmadd231ps_avx512vl(auVar198._0_32_,auVar108,local_360);
        auVar106 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar108,local_380);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar108,local_c0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar110,local_320);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar110,local_340);
        auVar105 = vfmadd231ps_avx512vl(auVar95,auVar110,local_a0);
        auVar89 = vfmadd231ps_fma(auVar96,auVar109,local_2e0);
        auVar197 = ZEXT1664(auVar89);
        auVar92 = vfmadd231ps_fma(auVar106,auVar109,local_300);
        auVar194 = ZEXT1664(auVar92);
        auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar66 * 4 + lVar69);
        auVar96 = *(undefined1 (*) [32])(lVar69 + 0x22023cc + lVar66 * 4);
        auVar98 = vfmadd231ps_avx512vl(auVar105,auVar109,local_80);
        auVar106 = *(undefined1 (*) [32])(lVar69 + 0x2202850 + lVar66 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar69 + 0x2202cd4 + lVar66 * 4);
        fVar76 = auVar105._0_4_;
        auVar201._0_4_ = fVar76 * (float)local_3a0._0_4_;
        fVar135 = auVar105._4_4_;
        auVar201._4_4_ = fVar135 * (float)local_3a0._4_4_;
        fVar136 = auVar105._8_4_;
        auVar201._8_4_ = fVar136 * fStack_398;
        fVar137 = auVar105._12_4_;
        auVar201._12_4_ = fVar137 * fStack_394;
        fVar138 = auVar105._16_4_;
        auVar201._16_4_ = fVar138 * fStack_390;
        fVar140 = auVar105._20_4_;
        auVar201._20_4_ = fVar140 * fStack_38c;
        auVar201._28_36_ = auVar200._28_36_;
        fVar141 = auVar105._24_4_;
        auVar201._24_4_ = fVar141 * fStack_388;
        auVar40._4_4_ = fVar135 * (float)local_3c0._4_4_;
        auVar40._0_4_ = fVar76 * (float)local_3c0._0_4_;
        auVar40._8_4_ = fVar136 * fStack_3b8;
        auVar40._12_4_ = fVar137 * fStack_3b4;
        auVar40._16_4_ = fVar138 * fStack_3b0;
        auVar40._20_4_ = fVar140 * fStack_3ac;
        auVar40._24_4_ = fVar141 * fStack_3a8;
        auVar40._28_4_ = uStack_3a4;
        auVar97 = vmulps_avx512vl(local_e0,auVar105);
        auVar99 = vfmadd231ps_avx512vl(auVar201._0_32_,auVar106,local_360);
        auVar100 = vfmadd231ps_avx512vl(auVar40,auVar106,local_380);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar106,local_c0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_320);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_340);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,local_a0);
        auVar91 = vfmadd231ps_fma(auVar99,auVar95,local_2e0);
        auVar200 = ZEXT1664(auVar91);
        auVar90 = vfmadd231ps_fma(auVar100,auVar95,local_300);
        auVar99 = vfmadd231ps_avx512vl(auVar97,auVar95,local_80);
        auVar100 = vmaxps_avx512vl(auVar98,auVar99);
        auVar97 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar89));
        auVar101 = vsubps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar92));
        auVar102 = vmulps_avx512vl(ZEXT1632(auVar92),auVar97);
        auVar103 = vmulps_avx512vl(ZEXT1632(auVar89),auVar101);
        auVar102 = vsubps_avx512vl(auVar102,auVar103);
        auVar103 = vmulps_avx512vl(auVar101,auVar101);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar97,auVar97);
        auVar100 = vmulps_avx512vl(auVar100,auVar100);
        auVar100 = vmulps_avx512vl(auVar100,auVar103);
        auVar102 = vmulps_avx512vl(auVar102,auVar102);
        uVar158 = vcmpps_avx512vl(auVar102,auVar100,2);
        bVar70 = (byte)uVar21 & (byte)uVar158;
        if (bVar70 != 0) {
          fVar139 = local_180._0_4_;
          fVar142 = local_180._4_4_;
          auVar41._4_4_ = fVar142 * fVar135;
          auVar41._0_4_ = fVar139 * fVar76;
          fVar76 = local_180._8_4_;
          auVar41._8_4_ = fVar76 * fVar136;
          fVar135 = local_180._12_4_;
          auVar41._12_4_ = fVar135 * fVar137;
          fVar136 = local_180._16_4_;
          auVar41._16_4_ = fVar136 * fVar138;
          fVar137 = local_180._20_4_;
          auVar41._20_4_ = fVar137 * fVar140;
          fVar138 = local_180._24_4_;
          auVar41._24_4_ = fVar138 * fVar141;
          auVar41._28_4_ = auVar105._28_4_;
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_160,auVar41);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar106);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_120,auVar96);
          auVar42._4_4_ = fVar142 * fVar203;
          auVar42._0_4_ = fVar139 * fVar164;
          auVar42._8_4_ = fVar76 * fVar204;
          auVar42._12_4_ = fVar135 * fVar205;
          auVar42._16_4_ = fVar136 * fVar163;
          auVar42._20_4_ = fVar137 * fVar172;
          auVar42._24_4_ = fVar138 * fVar75;
          auVar42._28_4_ = auVar107._28_4_;
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar42);
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_140,auVar108);
          auVar96 = vfmadd213ps_avx512vl(auVar109,local_120,auVar110);
          auVar109 = *(undefined1 (*) [32])(lVar69 + 0x2200d38 + lVar66 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar69 + 0x22011bc + lVar66 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar69 + 0x2201640 + lVar66 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar69 + 0x2201ac4 + lVar66 * 4);
          auVar106 = vmulps_avx512vl(_local_3a0,auVar107);
          auVar105 = vmulps_avx512vl(_local_3c0,auVar107);
          auVar43._4_4_ = fVar142 * auVar107._4_4_;
          auVar43._0_4_ = fVar139 * auVar107._0_4_;
          auVar43._8_4_ = fVar76 * auVar107._8_4_;
          auVar43._12_4_ = fVar135 * auVar107._12_4_;
          auVar43._16_4_ = fVar136 * auVar107._16_4_;
          auVar43._20_4_ = fVar137 * auVar107._20_4_;
          auVar43._24_4_ = fVar138 * auVar107._24_4_;
          auVar43._28_4_ = auVar107._28_4_;
          auVar107 = vfmadd231ps_avx512vl(auVar106,auVar108,local_360);
          auVar106 = vfmadd231ps_avx512vl(auVar105,auVar108,local_380);
          auVar108 = vfmadd231ps_avx512vl(auVar43,local_160,auVar108);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar110,local_320);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar110,local_340);
          auVar110 = vfmadd231ps_avx512vl(auVar108,local_140,auVar110);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,local_2e0);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,local_300);
          auVar105 = vfmadd231ps_avx512vl(auVar110,local_120,auVar109);
          auVar109 = *(undefined1 (*) [32])(lVar69 + 0x2203158 + lVar66 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar69 + 0x2203a60 + lVar66 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar69 + 0x2203ee4 + lVar66 * 4);
          auVar100 = vmulps_avx512vl(_local_3a0,auVar108);
          auVar102 = vmulps_avx512vl(_local_3c0,auVar108);
          auVar108 = vmulps_avx512vl(local_180,auVar108);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar110,local_360);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar110,local_380);
          auVar108 = vfmadd231ps_avx512vl(auVar108,local_160,auVar110);
          auVar218 = ZEXT1664(auVar218._0_16_);
          auVar110 = *(undefined1 (*) [32])(lVar69 + 0x22035dc + lVar66 * 4);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar110,local_320);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar110,local_340);
          auVar110 = vfmadd231ps_avx512vl(auVar108,local_140,auVar110);
          auVar219 = ZEXT1664(auVar219._0_16_);
          auVar108 = vfmadd231ps_avx512vl(auVar100,auVar109,local_2e0);
          auVar100 = vfmadd231ps_avx512vl(auVar102,auVar109,local_300);
          auVar110 = vfmadd231ps_avx512vl(auVar110,local_120,auVar109);
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar107,auVar102);
          vandps_avx512vl(auVar106,auVar102);
          auVar109 = vmaxps_avx(auVar102,auVar102);
          vandps_avx512vl(auVar105,auVar102);
          auVar109 = vmaxps_avx(auVar109,auVar102);
          uVar63 = vcmpps_avx512vl(auVar109,local_4c0,1);
          bVar12 = (bool)((byte)uVar63 & 1);
          auVar122._0_4_ = (float)((uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar107._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar107._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar107._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar107._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * auVar107._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * auVar107._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * auVar107._24_4_)
          ;
          bVar12 = SUB81(uVar63 >> 7,0);
          auVar122._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar107._28_4_;
          bVar12 = (bool)((byte)uVar63 & 1);
          auVar123._0_4_ = (float)((uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar106._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar106._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar106._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar123._12_4_ =
               (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar106._12_4_);
          bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar123._16_4_ =
               (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar106._16_4_);
          bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar123._20_4_ =
               (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar106._20_4_);
          bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar123._24_4_ =
               (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar106._24_4_);
          bVar12 = SUB81(uVar63 >> 7,0);
          auVar123._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar106._28_4_;
          vandps_avx512vl(auVar108,auVar102);
          vandps_avx512vl(auVar100,auVar102);
          auVar109 = vmaxps_avx(auVar123,auVar123);
          vandps_avx512vl(auVar110,auVar102);
          auVar109 = vmaxps_avx(auVar109,auVar123);
          uVar63 = vcmpps_avx512vl(auVar109,local_4c0,1);
          bVar12 = (bool)((byte)uVar63 & 1);
          auVar124._0_4_ = (uint)bVar12 * auVar97._0_4_ | (uint)!bVar12 * auVar108._0_4_;
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar108._4_4_;
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar108._8_4_;
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar108._12_4_;
          bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * auVar108._16_4_;
          bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * auVar108._20_4_;
          bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * auVar108._24_4_;
          bVar12 = SUB81(uVar63 >> 7,0);
          auVar124._28_4_ = (uint)bVar12 * auVar97._28_4_ | (uint)!bVar12 * auVar108._28_4_;
          bVar12 = (bool)((byte)uVar63 & 1);
          auVar125._0_4_ = (float)((uint)bVar12 * auVar101._0_4_ | (uint)!bVar12 * auVar100._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar100._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar100._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar100._12_4_);
          bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar125._16_4_ =
               (float)((uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar100._16_4_);
          bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar125._20_4_ =
               (float)((uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar100._20_4_);
          bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar125._24_4_ =
               (float)((uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar100._24_4_);
          bVar12 = SUB81(uVar63 >> 7,0);
          auVar125._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar100._28_4_;
          auVar207._8_4_ = 0x80000000;
          auVar207._0_8_ = 0x8000000080000000;
          auVar207._12_4_ = 0x80000000;
          auVar207._16_4_ = 0x80000000;
          auVar207._20_4_ = 0x80000000;
          auVar207._24_4_ = 0x80000000;
          auVar207._28_4_ = 0x80000000;
          auVar109 = vxorps_avx512vl(auVar124,auVar207);
          auVar88 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
          auVar110 = vfmadd213ps_avx512vl(auVar122,auVar122,ZEXT1632(auVar88));
          auVar6 = vfmadd231ps_fma(auVar110,auVar123,auVar123);
          auVar110 = vrsqrt14ps_avx512vl(ZEXT1632(auVar6));
          auVar217._8_4_ = 0xbf000000;
          auVar217._0_8_ = 0xbf000000bf000000;
          auVar217._12_4_ = 0xbf000000;
          auVar217._16_4_ = 0xbf000000;
          auVar217._20_4_ = 0xbf000000;
          auVar217._24_4_ = 0xbf000000;
          auVar217._28_4_ = 0xbf000000;
          fVar164 = auVar110._0_4_;
          fVar203 = auVar110._4_4_;
          fVar204 = auVar110._8_4_;
          fVar205 = auVar110._12_4_;
          fVar163 = auVar110._16_4_;
          fVar172 = auVar110._20_4_;
          fVar75 = auVar110._24_4_;
          auVar44._4_4_ = fVar203 * fVar203 * fVar203 * auVar6._4_4_ * -0.5;
          auVar44._0_4_ = fVar164 * fVar164 * fVar164 * auVar6._0_4_ * -0.5;
          auVar44._8_4_ = fVar204 * fVar204 * fVar204 * auVar6._8_4_ * -0.5;
          auVar44._12_4_ = fVar205 * fVar205 * fVar205 * auVar6._12_4_ * -0.5;
          auVar44._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
          auVar44._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar44._24_4_ = fVar75 * fVar75 * fVar75 * -0.0;
          auVar44._28_4_ = auVar123._28_4_;
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar110 = vfmadd231ps_avx512vl(auVar44,auVar108,auVar110);
          auVar45._4_4_ = auVar123._4_4_ * auVar110._4_4_;
          auVar45._0_4_ = auVar123._0_4_ * auVar110._0_4_;
          auVar45._8_4_ = auVar123._8_4_ * auVar110._8_4_;
          auVar45._12_4_ = auVar123._12_4_ * auVar110._12_4_;
          auVar45._16_4_ = auVar123._16_4_ * auVar110._16_4_;
          auVar45._20_4_ = auVar123._20_4_ * auVar110._20_4_;
          auVar45._24_4_ = auVar123._24_4_ * auVar110._24_4_;
          auVar45._28_4_ = 0;
          auVar46._4_4_ = auVar110._4_4_ * -auVar122._4_4_;
          auVar46._0_4_ = auVar110._0_4_ * -auVar122._0_4_;
          auVar46._8_4_ = auVar110._8_4_ * -auVar122._8_4_;
          auVar46._12_4_ = auVar110._12_4_ * -auVar122._12_4_;
          auVar46._16_4_ = auVar110._16_4_ * -auVar122._16_4_;
          auVar46._20_4_ = auVar110._20_4_ * -auVar122._20_4_;
          auVar46._24_4_ = auVar110._24_4_ * -auVar122._24_4_;
          auVar46._28_4_ = auVar123._28_4_;
          auVar107 = vmulps_avx512vl(auVar110,ZEXT1632(auVar88));
          auVar105 = ZEXT1632(auVar88);
          auVar110 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar105);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar125,auVar125);
          auVar106 = vrsqrt14ps_avx512vl(auVar110);
          auVar110 = vmulps_avx512vl(auVar110,auVar217);
          fVar164 = auVar106._0_4_;
          fVar203 = auVar106._4_4_;
          fVar204 = auVar106._8_4_;
          fVar205 = auVar106._12_4_;
          fVar163 = auVar106._16_4_;
          fVar172 = auVar106._20_4_;
          fVar75 = auVar106._24_4_;
          auVar47._4_4_ = fVar203 * fVar203 * fVar203 * auVar110._4_4_;
          auVar47._0_4_ = fVar164 * fVar164 * fVar164 * auVar110._0_4_;
          auVar47._8_4_ = fVar204 * fVar204 * fVar204 * auVar110._8_4_;
          auVar47._12_4_ = fVar205 * fVar205 * fVar205 * auVar110._12_4_;
          auVar47._16_4_ = fVar163 * fVar163 * fVar163 * auVar110._16_4_;
          auVar47._20_4_ = fVar172 * fVar172 * fVar172 * auVar110._20_4_;
          auVar47._24_4_ = fVar75 * fVar75 * fVar75 * auVar110._24_4_;
          auVar47._28_4_ = auVar110._28_4_;
          auVar110 = vfmadd231ps_avx512vl(auVar47,auVar108,auVar106);
          auVar48._4_4_ = auVar125._4_4_ * auVar110._4_4_;
          auVar48._0_4_ = auVar125._0_4_ * auVar110._0_4_;
          auVar48._8_4_ = auVar125._8_4_ * auVar110._8_4_;
          auVar48._12_4_ = auVar125._12_4_ * auVar110._12_4_;
          auVar48._16_4_ = auVar125._16_4_ * auVar110._16_4_;
          auVar48._20_4_ = auVar125._20_4_ * auVar110._20_4_;
          auVar48._24_4_ = auVar125._24_4_ * auVar110._24_4_;
          auVar48._28_4_ = auVar106._28_4_;
          auVar49._4_4_ = auVar110._4_4_ * auVar109._4_4_;
          auVar49._0_4_ = auVar110._0_4_ * auVar109._0_4_;
          auVar49._8_4_ = auVar110._8_4_ * auVar109._8_4_;
          auVar49._12_4_ = auVar110._12_4_ * auVar109._12_4_;
          auVar49._16_4_ = auVar110._16_4_ * auVar109._16_4_;
          auVar49._20_4_ = auVar110._20_4_ * auVar109._20_4_;
          auVar49._24_4_ = auVar110._24_4_ * auVar109._24_4_;
          auVar49._28_4_ = auVar109._28_4_;
          auVar109 = vmulps_avx512vl(auVar110,auVar105);
          auVar6 = vfmadd213ps_fma(auVar45,auVar98,ZEXT1632(auVar89));
          auVar18 = vfmadd213ps_fma(auVar46,auVar98,ZEXT1632(auVar92));
          auVar108 = vfmadd213ps_avx512vl(auVar107,auVar98,auVar96);
          auVar106 = vfmadd213ps_avx512vl(auVar48,auVar99,ZEXT1632(auVar91));
          auVar81 = vfnmadd213ps_fma(auVar45,auVar98,ZEXT1632(auVar89));
          auVar89 = vfmadd213ps_fma(auVar49,auVar99,ZEXT1632(auVar90));
          auVar82 = vfnmadd213ps_fma(auVar46,auVar98,ZEXT1632(auVar92));
          auVar92 = vfmadd213ps_fma(auVar109,auVar99,auVar95);
          auVar86 = vfnmadd231ps_fma(auVar96,auVar98,auVar107);
          auVar83 = vfnmadd213ps_fma(auVar48,auVar99,ZEXT1632(auVar91));
          auVar84 = vfnmadd213ps_fma(auVar49,auVar99,ZEXT1632(auVar90));
          auVar87 = vfnmadd231ps_fma(auVar95,auVar99,auVar109);
          auVar95 = vsubps_avx512vl(auVar106,ZEXT1632(auVar81));
          auVar109 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar82));
          auVar110 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar86));
          auVar50._4_4_ = auVar109._4_4_ * auVar86._4_4_;
          auVar50._0_4_ = auVar109._0_4_ * auVar86._0_4_;
          auVar50._8_4_ = auVar109._8_4_ * auVar86._8_4_;
          auVar50._12_4_ = auVar109._12_4_ * auVar86._12_4_;
          auVar50._16_4_ = auVar109._16_4_ * 0.0;
          auVar50._20_4_ = auVar109._20_4_ * 0.0;
          auVar50._24_4_ = auVar109._24_4_ * 0.0;
          auVar50._28_4_ = auVar107._28_4_;
          auVar91 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar82),auVar110);
          auVar51._4_4_ = auVar110._4_4_ * auVar81._4_4_;
          auVar51._0_4_ = auVar110._0_4_ * auVar81._0_4_;
          auVar51._8_4_ = auVar110._8_4_ * auVar81._8_4_;
          auVar51._12_4_ = auVar110._12_4_ * auVar81._12_4_;
          auVar51._16_4_ = auVar110._16_4_ * 0.0;
          auVar51._20_4_ = auVar110._20_4_ * 0.0;
          auVar51._24_4_ = auVar110._24_4_ * 0.0;
          auVar51._28_4_ = auVar110._28_4_;
          auVar90 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar86),auVar95);
          auVar52._4_4_ = auVar82._4_4_ * auVar95._4_4_;
          auVar52._0_4_ = auVar82._0_4_ * auVar95._0_4_;
          auVar52._8_4_ = auVar82._8_4_ * auVar95._8_4_;
          auVar52._12_4_ = auVar82._12_4_ * auVar95._12_4_;
          auVar52._16_4_ = auVar95._16_4_ * 0.0;
          auVar52._20_4_ = auVar95._20_4_ * 0.0;
          auVar52._24_4_ = auVar95._24_4_ * 0.0;
          auVar52._28_4_ = auVar95._28_4_;
          auVar85 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar81),auVar109);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar105,ZEXT1632(auVar90));
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,ZEXT1632(auVar91));
          auVar102 = ZEXT1632(auVar88);
          uVar63 = vcmpps_avx512vl(auVar109,auVar102,2);
          bVar62 = (byte)uVar63;
          fVar136 = (float)((uint)(bVar62 & 1) * auVar6._0_4_ |
                           (uint)!(bool)(bVar62 & 1) * auVar83._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          fVar138 = (float)((uint)bVar12 * auVar6._4_4_ | (uint)!bVar12 * auVar83._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          fVar141 = (float)((uint)bVar12 * auVar6._8_4_ | (uint)!bVar12 * auVar83._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          fVar142 = (float)((uint)bVar12 * auVar6._12_4_ | (uint)!bVar12 * auVar83._12_4_);
          auVar105 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar141,CONCAT44(fVar138,fVar136))));
          fVar137 = (float)((uint)(bVar62 & 1) * auVar18._0_4_ |
                           (uint)!(bool)(bVar62 & 1) * auVar84._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          fVar140 = (float)((uint)bVar12 * auVar18._4_4_ | (uint)!bVar12 * auVar84._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          fVar139 = (float)((uint)bVar12 * auVar18._8_4_ | (uint)!bVar12 * auVar84._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          fVar143 = (float)((uint)bVar12 * auVar18._12_4_ | (uint)!bVar12 * auVar84._12_4_);
          auVar97 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar139,CONCAT44(fVar140,fVar137))));
          auVar126._0_4_ =
               (float)((uint)(bVar62 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar62 & 1) * auVar87._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar87._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar87._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar87._12_4_)
          ;
          fVar204 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar108._16_4_);
          auVar126._16_4_ = fVar204;
          fVar203 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar108._20_4_);
          auVar126._20_4_ = fVar203;
          fVar164 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar108._24_4_);
          auVar126._24_4_ = fVar164;
          iVar1 = (uint)(byte)(uVar63 >> 7) * auVar108._28_4_;
          auVar126._28_4_ = iVar1;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar81),auVar106);
          auVar127._0_4_ =
               (uint)(bVar62 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar91._0_4_;
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar91._4_4_;
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar91._8_4_;
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar91._12_4_;
          auVar127._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar109._16_4_;
          auVar127._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar109._20_4_;
          auVar127._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar109._24_4_;
          auVar127._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar109._28_4_;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar89));
          auVar128._0_4_ =
               (float)((uint)(bVar62 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar62 & 1) * auVar6._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar6._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar6._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar6._12_4_);
          fVar163 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar109._16_4_);
          auVar128._16_4_ = fVar163;
          fVar172 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar109._20_4_);
          auVar128._20_4_ = fVar172;
          fVar205 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar109._24_4_);
          auVar128._24_4_ = fVar205;
          auVar128._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar109._28_4_;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar92));
          auVar129._0_4_ =
               (float)((uint)(bVar62 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar62 & 1) * auVar18._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar18._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar18._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar18._12_4_)
          ;
          fVar75 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar109._16_4_);
          auVar129._16_4_ = fVar75;
          fVar135 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar109._20_4_);
          auVar129._20_4_ = fVar135;
          fVar76 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar109._24_4_);
          auVar129._24_4_ = fVar76;
          iVar2 = (uint)(byte)(uVar63 >> 7) * auVar109._28_4_;
          auVar129._28_4_ = iVar2;
          auVar130._0_4_ =
               (uint)(bVar62 & 1) * (int)auVar81._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar106._0_4_;
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar12 * (int)auVar81._4_4_ | (uint)!bVar12 * auVar106._4_4_;
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar12 * (int)auVar81._8_4_ | (uint)!bVar12 * auVar106._8_4_;
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar12 * (int)auVar81._12_4_ | (uint)!bVar12 * auVar106._12_4_;
          auVar130._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar106._16_4_;
          auVar130._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar106._20_4_;
          auVar130._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar106._24_4_;
          auVar130._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar106._28_4_;
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar63 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar106 = vsubps_avx512vl(auVar130,auVar105);
          auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar82._12_4_ |
                                                   (uint)!bVar16 * auVar89._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar82._8_4_ |
                                                            (uint)!bVar14 * auVar89._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar82._4_4_ |
                                                                     (uint)!bVar12 * auVar89._4_4_,
                                                                     (uint)(bVar62 & 1) *
                                                                     (int)auVar82._0_4_ |
                                                                     (uint)!(bool)(bVar62 & 1) *
                                                                     auVar89._0_4_)))),auVar97);
          auVar197 = ZEXT3264(auVar110);
          auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar86._12_4_ |
                                                   (uint)!bVar17 * auVar92._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar86._8_4_ |
                                                            (uint)!bVar15 * auVar92._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar86._4_4_ |
                                                                     (uint)!bVar13 * auVar92._4_4_,
                                                                     (uint)(bVar62 & 1) *
                                                                     (int)auVar86._0_4_ |
                                                                     (uint)!(bool)(bVar62 & 1) *
                                                                     auVar92._0_4_)))),auVar126);
          auVar107 = vsubps_avx(auVar105,auVar127);
          auVar200 = ZEXT3264(auVar107);
          auVar95 = vsubps_avx(auVar97,auVar128);
          auVar96 = vsubps_avx(auVar126,auVar129);
          auVar53._4_4_ = auVar108._4_4_ * fVar138;
          auVar53._0_4_ = auVar108._0_4_ * fVar136;
          auVar53._8_4_ = auVar108._8_4_ * fVar141;
          auVar53._12_4_ = auVar108._12_4_ * fVar142;
          auVar53._16_4_ = auVar108._16_4_ * 0.0;
          auVar53._20_4_ = auVar108._20_4_ * 0.0;
          auVar53._24_4_ = auVar108._24_4_ * 0.0;
          auVar53._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar53,auVar126,auVar106);
          auVar179._0_4_ = fVar137 * auVar106._0_4_;
          auVar179._4_4_ = fVar140 * auVar106._4_4_;
          auVar179._8_4_ = fVar139 * auVar106._8_4_;
          auVar179._12_4_ = fVar143 * auVar106._12_4_;
          auVar179._16_4_ = auVar106._16_4_ * 0.0;
          auVar179._20_4_ = auVar106._20_4_ * 0.0;
          auVar179._24_4_ = auVar106._24_4_ * 0.0;
          auVar179._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar179,auVar105,auVar110);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar102,ZEXT1632(auVar89));
          auVar192._0_4_ = auVar110._0_4_ * auVar126._0_4_;
          auVar192._4_4_ = auVar110._4_4_ * auVar126._4_4_;
          auVar192._8_4_ = auVar110._8_4_ * auVar126._8_4_;
          auVar192._12_4_ = auVar110._12_4_ * auVar126._12_4_;
          auVar192._16_4_ = auVar110._16_4_ * fVar204;
          auVar192._20_4_ = auVar110._20_4_ * fVar203;
          auVar192._24_4_ = auVar110._24_4_ * fVar164;
          auVar192._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar192,auVar97,auVar108);
          auVar100 = vfmadd231ps_avx512vl(auVar109,auVar102,ZEXT1632(auVar89));
          auVar109 = vmulps_avx512vl(auVar96,auVar127);
          auVar109 = vfmsub231ps_avx512vl(auVar109,auVar107,auVar129);
          auVar54._4_4_ = auVar95._4_4_ * auVar129._4_4_;
          auVar54._0_4_ = auVar95._0_4_ * auVar129._0_4_;
          auVar54._8_4_ = auVar95._8_4_ * auVar129._8_4_;
          auVar54._12_4_ = auVar95._12_4_ * auVar129._12_4_;
          auVar54._16_4_ = auVar95._16_4_ * fVar75;
          auVar54._20_4_ = auVar95._20_4_ * fVar135;
          auVar54._24_4_ = auVar95._24_4_ * fVar76;
          auVar54._28_4_ = iVar2;
          auVar89 = vfmsub231ps_fma(auVar54,auVar128,auVar96);
          auVar193._0_4_ = auVar128._0_4_ * auVar107._0_4_;
          auVar193._4_4_ = auVar128._4_4_ * auVar107._4_4_;
          auVar193._8_4_ = auVar128._8_4_ * auVar107._8_4_;
          auVar193._12_4_ = auVar128._12_4_ * auVar107._12_4_;
          auVar193._16_4_ = fVar163 * auVar107._16_4_;
          auVar193._20_4_ = fVar172 * auVar107._20_4_;
          auVar193._24_4_ = fVar205 * auVar107._24_4_;
          auVar193._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar193,auVar95,auVar127);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar102,auVar109);
          auVar101 = vfmadd231ps_avx512vl(auVar109,auVar102,ZEXT1632(auVar89));
          auVar194 = ZEXT3264(auVar101);
          auVar109 = vmaxps_avx(auVar100,auVar101);
          uVar158 = vcmpps_avx512vl(auVar109,auVar102,2);
          bVar70 = bVar70 & (byte)uVar158;
          if (bVar70 != 0) {
            auVar55._4_4_ = auVar96._4_4_ * auVar110._4_4_;
            auVar55._0_4_ = auVar96._0_4_ * auVar110._0_4_;
            auVar55._8_4_ = auVar96._8_4_ * auVar110._8_4_;
            auVar55._12_4_ = auVar96._12_4_ * auVar110._12_4_;
            auVar55._16_4_ = auVar96._16_4_ * auVar110._16_4_;
            auVar55._20_4_ = auVar96._20_4_ * auVar110._20_4_;
            auVar55._24_4_ = auVar96._24_4_ * auVar110._24_4_;
            auVar55._28_4_ = auVar109._28_4_;
            auVar90 = vfmsub231ps_fma(auVar55,auVar95,auVar108);
            auVar56._4_4_ = auVar108._4_4_ * auVar107._4_4_;
            auVar56._0_4_ = auVar108._0_4_ * auVar107._0_4_;
            auVar56._8_4_ = auVar108._8_4_ * auVar107._8_4_;
            auVar56._12_4_ = auVar108._12_4_ * auVar107._12_4_;
            auVar56._16_4_ = auVar108._16_4_ * auVar107._16_4_;
            auVar56._20_4_ = auVar108._20_4_ * auVar107._20_4_;
            auVar56._24_4_ = auVar108._24_4_ * auVar107._24_4_;
            auVar56._28_4_ = auVar108._28_4_;
            auVar91 = vfmsub231ps_fma(auVar56,auVar106,auVar96);
            auVar57._4_4_ = auVar95._4_4_ * auVar106._4_4_;
            auVar57._0_4_ = auVar95._0_4_ * auVar106._0_4_;
            auVar57._8_4_ = auVar95._8_4_ * auVar106._8_4_;
            auVar57._12_4_ = auVar95._12_4_ * auVar106._12_4_;
            auVar57._16_4_ = auVar95._16_4_ * auVar106._16_4_;
            auVar57._20_4_ = auVar95._20_4_ * auVar106._20_4_;
            auVar57._24_4_ = auVar95._24_4_ * auVar106._24_4_;
            auVar57._28_4_ = auVar95._28_4_;
            auVar6 = vfmsub231ps_fma(auVar57,auVar107,auVar110);
            auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar6));
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar90),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar109 = vrcp14ps_avx512vl(ZEXT1632(auVar92));
            auVar31._8_4_ = 0x3f800000;
            auVar31._0_8_ = 0x3f8000003f800000;
            auVar31._12_4_ = 0x3f800000;
            auVar31._16_4_ = 0x3f800000;
            auVar31._20_4_ = 0x3f800000;
            auVar31._24_4_ = 0x3f800000;
            auVar31._28_4_ = 0x3f800000;
            auVar110 = vfnmadd213ps_avx512vl(auVar109,ZEXT1632(auVar92),auVar31);
            auVar89 = vfmadd132ps_fma(auVar110,auVar109,auVar109);
            auVar197 = ZEXT1664(auVar89);
            auVar58._4_4_ = auVar6._4_4_ * auVar126._4_4_;
            auVar58._0_4_ = auVar6._0_4_ * auVar126._0_4_;
            auVar58._8_4_ = auVar6._8_4_ * auVar126._8_4_;
            auVar58._12_4_ = auVar6._12_4_ * auVar126._12_4_;
            auVar58._16_4_ = fVar204 * 0.0;
            auVar58._20_4_ = fVar203 * 0.0;
            auVar58._24_4_ = fVar164 * 0.0;
            auVar58._28_4_ = iVar1;
            auVar91 = vfmadd231ps_fma(auVar58,auVar97,ZEXT1632(auVar91));
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar105,ZEXT1632(auVar90));
            fVar164 = auVar89._0_4_;
            fVar203 = auVar89._4_4_;
            fVar204 = auVar89._8_4_;
            fVar205 = auVar89._12_4_;
            local_280._28_4_ = auVar109._28_4_;
            local_280._0_28_ =
                 ZEXT1628(CONCAT412(auVar91._12_4_ * fVar205,
                                    CONCAT48(auVar91._8_4_ * fVar204,
                                             CONCAT44(auVar91._4_4_ * fVar203,
                                                      auVar91._0_4_ * fVar164))));
            auVar200 = ZEXT3264(local_280);
            auVar61._4_4_ = uStack_47c;
            auVar61._0_4_ = local_480;
            auVar61._8_4_ = uStack_478;
            auVar61._12_4_ = uStack_474;
            auVar61._16_4_ = uStack_470;
            auVar61._20_4_ = uStack_46c;
            auVar61._24_4_ = uStack_468;
            auVar61._28_4_ = uStack_464;
            uVar158 = vcmpps_avx512vl(local_280,auVar61,0xd);
            uVar157 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar32._4_4_ = uVar157;
            auVar32._0_4_ = uVar157;
            auVar32._8_4_ = uVar157;
            auVar32._12_4_ = uVar157;
            auVar32._16_4_ = uVar157;
            auVar32._20_4_ = uVar157;
            auVar32._24_4_ = uVar157;
            auVar32._28_4_ = uVar157;
            uVar21 = vcmpps_avx512vl(local_280,auVar32,2);
            bVar70 = (byte)uVar158 & (byte)uVar21 & bVar70;
            if (bVar70 != 0) {
              uVar72 = vcmpps_avx512vl(ZEXT1632(auVar92),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar72 = bVar70 & uVar72;
              if ((char)uVar72 != '\0') {
                fVar163 = auVar100._0_4_ * fVar164;
                fVar172 = auVar100._4_4_ * fVar203;
                auVar59._4_4_ = fVar172;
                auVar59._0_4_ = fVar163;
                fVar75 = auVar100._8_4_ * fVar204;
                auVar59._8_4_ = fVar75;
                fVar76 = auVar100._12_4_ * fVar205;
                auVar59._12_4_ = fVar76;
                fVar135 = auVar100._16_4_ * 0.0;
                auVar59._16_4_ = fVar135;
                fVar136 = auVar100._20_4_ * 0.0;
                auVar59._20_4_ = fVar136;
                fVar137 = auVar100._24_4_ * 0.0;
                auVar59._24_4_ = fVar137;
                auVar59._28_4_ = auVar100._28_4_;
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar171._16_4_ = 0x3f800000;
                auVar171._20_4_ = 0x3f800000;
                auVar171._24_4_ = 0x3f800000;
                auVar171._28_4_ = 0x3f800000;
                auVar109 = vsubps_avx(auVar171,auVar59);
                local_2c0._0_4_ =
                     (float)((uint)(bVar62 & 1) * (int)fVar163 |
                            (uint)!(bool)(bVar62 & 1) * auVar109._0_4_);
                bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar172 | (uint)!bVar12 * auVar109._4_4_);
                bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar75 | (uint)!bVar12 * auVar109._8_4_);
                bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar76 | (uint)!bVar12 * auVar109._12_4_);
                bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar109._16_4_);
                bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar136 | (uint)!bVar12 * auVar109._20_4_);
                bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar137 | (uint)!bVar12 * auVar109._24_4_);
                bVar12 = SUB81(uVar63 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar109._28_4_);
                auVar109 = vsubps_avx(auVar99,auVar98);
                auVar89 = vfmadd213ps_fma(auVar109,local_2c0,auVar98);
                uVar157 = *(undefined4 *)((long)local_540->ray_space + k * 4 + -0x10);
                auVar33._4_4_ = uVar157;
                auVar33._0_4_ = uVar157;
                auVar33._8_4_ = uVar157;
                auVar33._12_4_ = uVar157;
                auVar33._16_4_ = uVar157;
                auVar33._20_4_ = uVar157;
                auVar33._24_4_ = uVar157;
                auVar33._28_4_ = uVar157;
                auVar109 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                              CONCAT48(auVar89._8_4_ + auVar89._8_4_
                                                                       ,CONCAT44(auVar89._4_4_ +
                                                                                 auVar89._4_4_,
                                                                                 auVar89._0_4_ +
                                                                                 auVar89._0_4_)))),
                                           auVar33);
                uVar74 = vcmpps_avx512vl(local_280,auVar109,6);
                uVar72 = uVar72 & uVar74;
                uVar71 = (uint)uVar72;
                bVar70 = (byte)uVar72;
                if (bVar70 != 0) {
                  auVar162._0_4_ = auVar101._0_4_ * fVar164;
                  auVar162._4_4_ = auVar101._4_4_ * fVar203;
                  auVar162._8_4_ = auVar101._8_4_ * fVar204;
                  auVar162._12_4_ = auVar101._12_4_ * fVar205;
                  auVar162._16_4_ = auVar101._16_4_ * 0.0;
                  auVar162._20_4_ = auVar101._20_4_ * 0.0;
                  auVar162._24_4_ = auVar101._24_4_ * 0.0;
                  auVar162._28_4_ = 0;
                  auVar180._8_4_ = 0x3f800000;
                  auVar180._0_8_ = 0x3f8000003f800000;
                  auVar180._12_4_ = 0x3f800000;
                  auVar180._16_4_ = 0x3f800000;
                  auVar180._20_4_ = 0x3f800000;
                  auVar180._24_4_ = 0x3f800000;
                  auVar180._28_4_ = 0x3f800000;
                  auVar109 = vsubps_avx(auVar180,auVar162);
                  auVar131._0_4_ =
                       (uint)(bVar62 & 1) * (int)auVar162._0_4_ |
                       (uint)!(bool)(bVar62 & 1) * auVar109._0_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
                  auVar131._4_4_ =
                       (uint)bVar12 * (int)auVar162._4_4_ | (uint)!bVar12 * auVar109._4_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
                  auVar131._8_4_ =
                       (uint)bVar12 * (int)auVar162._8_4_ | (uint)!bVar12 * auVar109._8_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
                  auVar131._12_4_ =
                       (uint)bVar12 * (int)auVar162._12_4_ | (uint)!bVar12 * auVar109._12_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
                  auVar131._16_4_ =
                       (uint)bVar12 * (int)auVar162._16_4_ | (uint)!bVar12 * auVar109._16_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
                  auVar131._20_4_ =
                       (uint)bVar12 * (int)auVar162._20_4_ | (uint)!bVar12 * auVar109._20_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
                  auVar131._24_4_ =
                       (uint)bVar12 * (int)auVar162._24_4_ | (uint)!bVar12 * auVar109._24_4_;
                  auVar131._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar109._28_4_;
                  auVar34._8_4_ = 0x40000000;
                  auVar34._0_8_ = 0x4000000040000000;
                  auVar34._12_4_ = 0x40000000;
                  auVar34._16_4_ = 0x40000000;
                  auVar34._20_4_ = 0x40000000;
                  auVar34._24_4_ = 0x40000000;
                  auVar34._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar131,auVar180,auVar34);
                  local_260 = (int)lVar66;
                  local_25c = iVar7;
                  local_250 = local_5a0._0_8_;
                  uStack_248 = local_5a0._8_8_;
                  local_240 = local_5b0._0_8_;
                  uStack_238 = local_5b0._8_8_;
                  local_230 = local_5c0._0_8_;
                  uStack_228 = local_5c0._8_8_;
                  local_220 = local_5d0;
                  uStack_218 = uStack_5c8;
                  pGVar68 = (context->scene->geometries).items[local_5d8].ptr;
                  if ((pGVar68->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar89 = vcvtsi2ss_avx512f(auVar88,(int)lVar66);
                    fVar164 = auVar89._0_4_;
                    local_200[0] = (fVar164 + local_2c0._0_4_ + 0.0) * local_100;
                    local_200[1] = (fVar164 + local_2c0._4_4_ + 1.0) * fStack_fc;
                    local_200[2] = (fVar164 + local_2c0._8_4_ + 2.0) * fStack_f8;
                    local_200[3] = (fVar164 + local_2c0._12_4_ + 3.0) * fStack_f4;
                    fStack_1f0 = (fVar164 + local_2c0._16_4_ + 4.0) * fStack_f0;
                    fStack_1ec = (fVar164 + local_2c0._20_4_ + 5.0) * fStack_ec;
                    fStack_1e8 = (fVar164 + local_2c0._24_4_ + 6.0) * fStack_e8;
                    fStack_1e4 = fVar164 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar152._8_4_ = 0x7f800000;
                    auVar152._0_8_ = 0x7f8000007f800000;
                    auVar152._12_4_ = 0x7f800000;
                    auVar152._16_4_ = 0x7f800000;
                    auVar152._20_4_ = 0x7f800000;
                    auVar152._24_4_ = 0x7f800000;
                    auVar152._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar152,local_280);
                    auVar132._0_4_ =
                         (uint)(bVar70 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar70 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
                    auVar132._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
                    auVar132._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
                    auVar132._12_4_ = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 4) & 1);
                    auVar132._16_4_ = (uint)bVar12 * auVar109._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 5) & 1);
                    auVar132._20_4_ = (uint)bVar12 * auVar109._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar72 >> 6) & 1);
                    auVar132._24_4_ = (uint)bVar12 * auVar109._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar72 >> 7,0);
                    auVar132._28_4_ = (uint)bVar12 * auVar109._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar109 = vshufps_avx(auVar132,auVar132,0xb1);
                    auVar109 = vminps_avx(auVar132,auVar109);
                    auVar110 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    auVar110 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    uVar158 = vcmpps_avx512vl(auVar132,auVar109,0);
                    if ((bVar70 & (byte)uVar158) != 0) {
                      uVar71 = (uint)(bVar70 & (byte)uVar158);
                    }
                    uVar65 = 0;
                    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                      uVar65 = uVar65 + 1;
                    }
                    uVar63 = (ulong)uVar65;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar68->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_560 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      local_548 = pGVar68;
                      local_538 = uVar73;
                      local_520 = local_280;
                      do {
                        fVar164 = local_200[uVar63];
                        local_420._4_4_ = fVar164;
                        local_420._0_4_ = fVar164;
                        local_420._8_4_ = fVar164;
                        local_420._12_4_ = fVar164;
                        local_410 = *(undefined4 *)(local_1e0 + uVar63 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar63 * 4);
                        local_590.context = context->user;
                        fVar203 = 1.0 - fVar164;
                        auVar26._8_4_ = 0x80000000;
                        auVar26._0_8_ = 0x8000000080000000;
                        auVar26._12_4_ = 0x80000000;
                        auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar203),auVar26);
                        auVar89 = ZEXT416((uint)(fVar164 * fVar203 * 4.0));
                        auVar92 = vfnmsub213ss_fma(local_420,local_420,auVar89);
                        auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),
                                                  auVar89);
                        fVar203 = fVar203 * auVar91._0_4_ * 0.5;
                        fVar204 = auVar92._0_4_ * 0.5;
                        auVar197 = ZEXT464((uint)fVar204);
                        fVar205 = auVar89._0_4_ * 0.5;
                        fVar164 = fVar164 * fVar164 * 0.5;
                        auVar186._0_4_ = fVar164 * (float)local_5d0._0_4_;
                        auVar186._4_4_ = fVar164 * (float)local_5d0._4_4_;
                        auVar186._8_4_ = fVar164 * (float)uStack_5c8;
                        auVar186._12_4_ = fVar164 * uStack_5c8._4_4_;
                        auVar145._4_4_ = fVar205;
                        auVar145._0_4_ = fVar205;
                        auVar145._8_4_ = fVar205;
                        auVar145._12_4_ = fVar205;
                        auVar89 = vfmadd132ps_fma(auVar145,auVar186,local_5c0);
                        auVar187._4_4_ = fVar204;
                        auVar187._0_4_ = fVar204;
                        auVar187._8_4_ = fVar204;
                        auVar187._12_4_ = fVar204;
                        auVar89 = vfmadd132ps_fma(auVar187,auVar89,local_5b0);
                        auVar146._4_4_ = fVar203;
                        auVar146._0_4_ = fVar203;
                        auVar146._8_4_ = fVar203;
                        auVar146._12_4_ = fVar203;
                        auVar89 = vfmadd132ps_fma(auVar146,auVar89,local_5a0);
                        local_450 = auVar89._0_4_;
                        local_440 = vshufps_avx(auVar89,auVar89,0x55);
                        auVar194 = ZEXT1664(local_440);
                        local_430 = vshufps_avx(auVar89,auVar89,0xaa);
                        iStack_44c = local_450;
                        iStack_448 = local_450;
                        iStack_444 = local_450;
                        uStack_40c = local_410;
                        uStack_408 = local_410;
                        uStack_404 = local_410;
                        local_400 = local_4e0._0_8_;
                        uStack_3f8 = local_4e0._8_8_;
                        local_3f0 = local_4d0;
                        vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                        uStack_3dc = (local_590.context)->instID[0];
                        local_3e0 = uStack_3dc;
                        uStack_3d8 = uStack_3dc;
                        uStack_3d4 = uStack_3dc;
                        uStack_3d0 = (local_590.context)->instPrimID[0];
                        uStack_3cc = uStack_3d0;
                        uStack_3c8 = uStack_3d0;
                        uStack_3c4 = uStack_3d0;
                        local_5f0 = local_4f0;
                        local_590.valid = (int *)local_5f0;
                        local_590.geometryUserPtr = pGVar68->userPtr;
                        local_590.hit = (RTCHitN *)&local_450;
                        local_590.N = 4;
                        local_590.ray = (RTCRayN *)ray;
                        if (pGVar68->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar194 = ZEXT1664(local_440);
                          auVar197 = ZEXT464((uint)fVar204);
                          (*pGVar68->intersectionFilterN)(&local_590);
                          auVar200 = ZEXT3264(local_520);
                          pGVar68 = local_548;
                        }
                        uVar73 = vptestmd_avx512vl(local_5f0,local_5f0);
                        if ((uVar73 & 0xf) == 0) {
LAB_018e6092:
                          *(undefined4 *)(ray + k * 4 + 0x80) = local_560._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar68->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar194 = ZEXT1664(auVar194._0_16_);
                            auVar197 = ZEXT1664(auVar197._0_16_);
                            (*p_Var11)(&local_590);
                            auVar200 = ZEXT3264(local_520);
                            pGVar68 = local_548;
                          }
                          uVar73 = vptestmd_avx512vl(local_5f0,local_5f0);
                          uVar73 = uVar73 & 0xf;
                          bVar70 = (byte)uVar73;
                          if (bVar70 == 0) goto LAB_018e6092;
                          iVar1 = *(int *)(local_590.hit + 4);
                          iVar2 = *(int *)(local_590.hit + 8);
                          iVar60 = *(int *)(local_590.hit + 0xc);
                          bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar14 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0xc0) =
                               (uint)(bVar70 & 1) * *(int *)local_590.hit |
                               (uint)!(bool)(bVar70 & 1) * *(int *)(local_590.ray + 0xc0);
                          *(uint *)(local_590.ray + 0xc4) =
                               (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xc4)
                          ;
                          *(uint *)(local_590.ray + 200) =
                               (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 200);
                          *(uint *)(local_590.ray + 0xcc) =
                               (uint)bVar14 * iVar60 |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0xcc);
                          iVar1 = *(int *)(local_590.hit + 0x14);
                          iVar2 = *(int *)(local_590.hit + 0x18);
                          iVar60 = *(int *)(local_590.hit + 0x1c);
                          bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar14 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0xd0) =
                               (uint)(bVar70 & 1) * *(int *)(local_590.hit + 0x10) |
                               (uint)!(bool)(bVar70 & 1) * *(int *)(local_590.ray + 0xd0);
                          *(uint *)(local_590.ray + 0xd4) =
                               (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xd4)
                          ;
                          *(uint *)(local_590.ray + 0xd8) =
                               (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xd8)
                          ;
                          *(uint *)(local_590.ray + 0xdc) =
                               (uint)bVar14 * iVar60 |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0xdc);
                          iVar1 = *(int *)(local_590.hit + 0x24);
                          iVar2 = *(int *)(local_590.hit + 0x28);
                          iVar60 = *(int *)(local_590.hit + 0x2c);
                          bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar14 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0xe0) =
                               (uint)(bVar70 & 1) * *(int *)(local_590.hit + 0x20) |
                               (uint)!(bool)(bVar70 & 1) * *(int *)(local_590.ray + 0xe0);
                          *(uint *)(local_590.ray + 0xe4) =
                               (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xe4)
                          ;
                          *(uint *)(local_590.ray + 0xe8) =
                               (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xe8)
                          ;
                          *(uint *)(local_590.ray + 0xec) =
                               (uint)bVar14 * iVar60 |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0xec);
                          iVar1 = *(int *)(local_590.hit + 0x34);
                          iVar2 = *(int *)(local_590.hit + 0x38);
                          iVar60 = *(int *)(local_590.hit + 0x3c);
                          bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar14 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0xf0) =
                               (uint)(bVar70 & 1) * *(int *)(local_590.hit + 0x30) |
                               (uint)!(bool)(bVar70 & 1) * *(int *)(local_590.ray + 0xf0);
                          *(uint *)(local_590.ray + 0xf4) =
                               (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_590.ray + 0xf4)
                          ;
                          *(uint *)(local_590.ray + 0xf8) =
                               (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_590.ray + 0xf8)
                          ;
                          *(uint *)(local_590.ray + 0xfc) =
                               (uint)bVar14 * iVar60 |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0xfc);
                          iVar1 = *(int *)(local_590.hit + 0x44);
                          iVar2 = *(int *)(local_590.hit + 0x48);
                          iVar60 = *(int *)(local_590.hit + 0x4c);
                          bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar14 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0x100) =
                               (uint)(bVar70 & 1) * *(int *)(local_590.hit + 0x40) |
                               (uint)!(bool)(bVar70 & 1) * *(int *)(local_590.ray + 0x100);
                          *(uint *)(local_590.ray + 0x104) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_590.ray + 0x104);
                          *(uint *)(local_590.ray + 0x108) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_590.ray + 0x108);
                          *(uint *)(local_590.ray + 0x10c) =
                               (uint)bVar14 * iVar60 |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0x10c);
                          auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar89;
                          auVar89 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar89;
                          auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar89;
                          auVar89 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar89;
                          local_560._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_560._4_4_ = 0;
                          local_560._8_4_ = 0;
                          local_560._12_4_ = 0;
                        }
                        bVar70 = ~(byte)(1 << ((uint)uVar63 & 0x1f)) & (byte)uVar72;
                        auVar153._4_4_ = local_560._0_4_;
                        auVar153._0_4_ = local_560._0_4_;
                        auVar153._8_4_ = local_560._0_4_;
                        auVar153._12_4_ = local_560._0_4_;
                        auVar153._16_4_ = local_560._0_4_;
                        auVar153._20_4_ = local_560._0_4_;
                        auVar153._24_4_ = local_560._0_4_;
                        auVar153._28_4_ = local_560._0_4_;
                        uVar158 = vcmpps_avx512vl(auVar200._0_32_,auVar153,2);
                        if ((bVar70 & (byte)uVar158) == 0) goto LAB_018e6132;
                        bVar70 = bVar70 & (byte)uVar158;
                        uVar72 = (ulong)bVar70;
                        auVar154._8_4_ = 0x7f800000;
                        auVar154._0_8_ = 0x7f8000007f800000;
                        auVar154._12_4_ = 0x7f800000;
                        auVar154._16_4_ = 0x7f800000;
                        auVar154._20_4_ = 0x7f800000;
                        auVar154._24_4_ = 0x7f800000;
                        auVar154._28_4_ = 0x7f800000;
                        auVar109 = vblendmps_avx512vl(auVar154,auVar200._0_32_);
                        auVar133._0_4_ =
                             (uint)(bVar70 & 1) * auVar109._0_4_ |
                             (uint)!(bool)(bVar70 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar70 >> 1 & 1);
                        auVar133._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar70 >> 2 & 1);
                        auVar133._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar70 >> 3 & 1);
                        auVar133._12_4_ =
                             (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar70 >> 4 & 1);
                        auVar133._16_4_ =
                             (uint)bVar12 * auVar109._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar70 >> 5 & 1);
                        auVar133._20_4_ =
                             (uint)bVar12 * auVar109._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar70 >> 6 & 1);
                        auVar133._24_4_ =
                             (uint)bVar12 * auVar109._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar133._28_4_ =
                             (uint)(bVar70 >> 7) * auVar109._28_4_ |
                             (uint)!(bool)(bVar70 >> 7) * 0x7f800000;
                        auVar109 = vshufps_avx(auVar133,auVar133,0xb1);
                        auVar109 = vminps_avx(auVar133,auVar109);
                        auVar110 = vshufpd_avx(auVar109,auVar109,5);
                        auVar109 = vminps_avx(auVar109,auVar110);
                        auVar110 = vpermpd_avx2(auVar109,0x4e);
                        auVar109 = vminps_avx(auVar109,auVar110);
                        uVar158 = vcmpps_avx512vl(auVar133,auVar109,0);
                        bVar62 = (byte)uVar158 & bVar70;
                        if (bVar62 != 0) {
                          bVar70 = bVar62;
                        }
                        uVar71 = 0;
                        for (uVar65 = (uint)bVar70; (uVar65 & 1) == 0;
                            uVar65 = uVar65 >> 1 | 0x80000000) {
                          uVar71 = uVar71 + 1;
                        }
                        uVar63 = (ulong)uVar71;
                      } while( true );
                    }
                    fVar164 = local_200[uVar63];
                    uVar157 = *(undefined4 *)(local_1e0 + uVar63 * 4);
                    fVar203 = 1.0 - fVar164;
                    auVar25._8_4_ = 0x80000000;
                    auVar25._0_8_ = 0x8000000080000000;
                    auVar25._12_4_ = 0x80000000;
                    auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar203),auVar25);
                    auVar89 = ZEXT416((uint)(fVar164 * fVar203 * 4.0));
                    auVar92 = vfnmsub213ss_fma(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),auVar89
                                              );
                    auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),auVar89)
                    ;
                    fVar203 = fVar203 * auVar91._0_4_ * 0.5;
                    fVar204 = auVar92._0_4_ * 0.5;
                    auVar197 = ZEXT464((uint)fVar204);
                    fVar205 = auVar89._0_4_ * 0.5;
                    fVar163 = fVar164 * fVar164 * 0.5;
                    auVar184._0_4_ = fVar163 * (float)local_5d0._0_4_;
                    auVar184._4_4_ = fVar163 * (float)local_5d0._4_4_;
                    auVar184._8_4_ = fVar163 * (float)uStack_5c8;
                    auVar184._12_4_ = fVar163 * uStack_5c8._4_4_;
                    auVar168._4_4_ = fVar205;
                    auVar168._0_4_ = fVar205;
                    auVar168._8_4_ = fVar205;
                    auVar168._12_4_ = fVar205;
                    auVar89 = vfmadd132ps_fma(auVar168,auVar184,local_5c0);
                    auVar185._4_4_ = fVar204;
                    auVar185._0_4_ = fVar204;
                    auVar185._8_4_ = fVar204;
                    auVar185._12_4_ = fVar204;
                    auVar89 = vfmadd132ps_fma(auVar185,auVar89,local_5b0);
                    auVar194 = ZEXT1664(auVar89);
                    auVar169._4_4_ = fVar203;
                    auVar169._0_4_ = fVar203;
                    auVar169._8_4_ = fVar203;
                    auVar169._12_4_ = fVar203;
                    auVar89 = vfmadd132ps_fma(auVar169,auVar89,local_5a0);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar63 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar89._0_4_;
                    uVar8 = vextractps_avx(auVar89,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                    uVar8 = vextractps_avx(auVar89,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar8;
                    *(float *)(ray + k * 4 + 0xf0) = fVar164;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar157;
                    *(int *)(ray + k * 4 + 0x110) = (int)uVar73;
                    *(int *)(ray + k * 4 + 0x120) = (int)local_5d8;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_018e5d9b;
      }
    }
    uVar157 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar24._4_4_ = uVar157;
    auVar24._0_4_ = uVar157;
    auVar24._8_4_ = uVar157;
    auVar24._12_4_ = uVar157;
    uVar158 = vcmpps_avx512vl(local_190,auVar24,2);
    local_528 = (ulong)((uint)local_528 & (uint)local_528 + 0xf & (uint)uVar158);
  } while( true );
LAB_018e6132:
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar218 = ZEXT1664(auVar89);
  auVar219 = ZEXT464(0xbf800000);
  prim = local_5e0;
  uVar73 = local_538;
LAB_018e5d9b:
  lVar66 = lVar66 + 8;
  goto LAB_018e54b8;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }